

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiMBIntersectorK<4,8>::
     occluded_n<embree::avx512::OrientedCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  Primitive PVar5;
  uint uVar6;
  Geometry *pGVar7;
  __int_type_conflict _Var8;
  long lVar9;
  long lVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  byte bVar45;
  uint uVar46;
  ulong uVar47;
  uint uVar49;
  ulong uVar50;
  long lVar51;
  uint uVar52;
  long lVar53;
  uint uVar54;
  bool bVar55;
  bool bVar56;
  ulong uVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar109 [32];
  undefined1 auVar111 [32];
  undefined1 auVar113 [32];
  undefined1 auVar115 [32];
  int iVar117;
  float fVar118;
  undefined4 uVar119;
  float fVar124;
  vint4 bi_2;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  vint4 bi_1;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [32];
  vint4 bi;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  float fVar147;
  float fVar165;
  float fVar166;
  undefined1 auVar149 [16];
  float fVar167;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  vint4 ai_2;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  vint4 ai_1;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  float fVar206;
  vint4 ai;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [32];
  float fVar221;
  float fVar222;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  float fVar223;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  __m128 a;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar240 [16];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  float fVar246;
  float fVar247;
  float fVar257;
  float fVar259;
  vfloat4 a0_2;
  undefined1 auVar248 [16];
  float fVar258;
  float fVar260;
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  float fVar261;
  float fVar262;
  float fVar263;
  vfloat4 a0_3;
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  vfloat4 b0_2;
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  vfloat4 b0_3;
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [64];
  undefined1 auVar298 [64];
  undefined1 in_ZMM24 [64];
  undefined1 auVar299 [64];
  undefined1 auVar300 [64];
  undefined1 auVar301 [64];
  undefined1 auVar302 [64];
  int iVar303;
  undefined1 in_ZMM31 [64];
  undefined1 auVar304 [64];
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_5a1;
  float local_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  uint auStack_440 [4];
  RTCFilterFunctionNArguments local_430;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [8];
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  undefined1 local_350 [16];
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  uint uStack_260;
  float afStack_25c [7];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar48;
  undefined1 auVar108 [32];
  undefined1 auVar110 [32];
  undefined1 auVar112 [32];
  undefined1 auVar114 [32];
  undefined1 auVar116 [32];
  float fVar148;
  undefined1 auVar284 [32];
  
  PVar5 = prim[1];
  uVar47 = (ulong)(byte)PVar5;
  lVar51 = uVar47 * 0x25;
  fVar118 = *(float *)(prim + lVar51 + 0x12);
  auVar58 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar58 = vinsertps_avx(auVar58,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar59 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar59 = vinsertps_avx(auVar59,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar58 = vsubps_avx(auVar58,*(undefined1 (*) [16])(prim + lVar51 + 6));
  auVar82._0_4_ = fVar118 * auVar58._0_4_;
  auVar82._4_4_ = fVar118 * auVar58._4_4_;
  auVar82._8_4_ = fVar118 * auVar58._8_4_;
  auVar82._12_4_ = fVar118 * auVar58._12_4_;
  auVar58 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar47 * 4 + 6)));
  auVar61._0_4_ = fVar118 * auVar59._0_4_;
  auVar61._4_4_ = fVar118 * auVar59._4_4_;
  auVar61._8_4_ = fVar118 * auVar59._8_4_;
  auVar61._12_4_ = fVar118 * auVar59._12_4_;
  auVar58 = vcvtdq2ps_avx(auVar58);
  auVar59 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar47 * 5 + 6)));
  auVar59 = vcvtdq2ps_avx(auVar59);
  auVar68 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar47 * 6 + 6)));
  auVar67 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar47 * 0xf + 6)));
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar5 * 0x10 + 6)));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar71 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar5 * 0x10 + uVar47 + 6)));
  auVar71 = vcvtdq2ps_avx(auVar71);
  auVar72 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar47 * 0x1a + 6)));
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar73 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar47 * 0x1b + 6)));
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar47 * 0x1c + 6)));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar177._4_4_ = auVar61._0_4_;
  auVar177._0_4_ = auVar61._0_4_;
  auVar177._8_4_ = auVar61._0_4_;
  auVar177._12_4_ = auVar61._0_4_;
  auVar76 = vshufps_avx(auVar61,auVar61,0x55);
  auVar77 = vshufps_avx(auVar61,auVar61,0xaa);
  fVar118 = auVar77._0_4_;
  auVar83._0_4_ = fVar118 * auVar68._0_4_;
  fVar124 = auVar77._4_4_;
  auVar83._4_4_ = fVar124 * auVar68._4_4_;
  fVar263 = auVar77._8_4_;
  auVar83._8_4_ = fVar263 * auVar68._8_4_;
  fVar247 = auVar77._12_4_;
  auVar83._12_4_ = fVar247 * auVar68._12_4_;
  auVar69._0_4_ = auVar71._0_4_ * fVar118;
  auVar69._4_4_ = auVar71._4_4_ * fVar124;
  auVar69._8_4_ = auVar71._8_4_ * fVar263;
  auVar69._12_4_ = auVar71._12_4_ * fVar247;
  auVar62._0_4_ = auVar75._0_4_ * fVar118;
  auVar62._4_4_ = auVar75._4_4_ * fVar124;
  auVar62._8_4_ = auVar75._8_4_ * fVar263;
  auVar62._12_4_ = auVar75._12_4_ * fVar247;
  auVar77 = vfmadd231ps_fma(auVar83,auVar76,auVar59);
  auVar78 = vfmadd231ps_fma(auVar69,auVar76,auVar74);
  auVar76 = vfmadd231ps_fma(auVar62,auVar73,auVar76);
  auVar79 = vfmadd231ps_fma(auVar77,auVar177,auVar58);
  auVar78 = vfmadd231ps_fma(auVar78,auVar177,auVar67);
  auVar80 = vfmadd231ps_fma(auVar76,auVar72,auVar177);
  auVar285._4_4_ = auVar82._0_4_;
  auVar285._0_4_ = auVar82._0_4_;
  auVar285._8_4_ = auVar82._0_4_;
  auVar285._12_4_ = auVar82._0_4_;
  auVar76 = vshufps_avx(auVar82,auVar82,0x55);
  auVar77 = vshufps_avx(auVar82,auVar82,0xaa);
  fVar118 = auVar77._0_4_;
  auVar178._0_4_ = fVar118 * auVar68._0_4_;
  fVar124 = auVar77._4_4_;
  auVar178._4_4_ = fVar124 * auVar68._4_4_;
  fVar263 = auVar77._8_4_;
  auVar178._8_4_ = fVar263 * auVar68._8_4_;
  fVar247 = auVar77._12_4_;
  auVar178._12_4_ = fVar247 * auVar68._12_4_;
  auVar168._0_4_ = auVar71._0_4_ * fVar118;
  auVar168._4_4_ = auVar71._4_4_ * fVar124;
  auVar168._8_4_ = auVar71._8_4_ * fVar263;
  auVar168._12_4_ = auVar71._12_4_ * fVar247;
  auVar149._0_4_ = auVar75._0_4_ * fVar118;
  auVar149._4_4_ = auVar75._4_4_ * fVar124;
  auVar149._8_4_ = auVar75._8_4_ * fVar263;
  auVar149._12_4_ = auVar75._12_4_ * fVar247;
  auVar59 = vfmadd231ps_fma(auVar178,auVar76,auVar59);
  auVar68 = vfmadd231ps_fma(auVar168,auVar76,auVar74);
  auVar74 = vfmadd231ps_fma(auVar149,auVar76,auVar73);
  auVar60 = vfmadd231ps_fma(auVar59,auVar285,auVar58);
  auVar61 = vfmadd231ps_fma(auVar68,auVar285,auVar67);
  auVar58 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar299 = ZEXT1664(auVar58);
  auVar62 = vfmadd231ps_fma(auVar74,auVar285,auVar72);
  auVar59 = vandps_avx512vl(auVar79,auVar58);
  auVar207._8_4_ = 0x219392ef;
  auVar207._0_8_ = 0x219392ef219392ef;
  auVar207._12_4_ = 0x219392ef;
  uVar57 = vcmpps_avx512vl(auVar59,auVar207,1);
  bVar55 = (bool)((byte)uVar57 & 1);
  auVar63._0_4_ = (uint)bVar55 * 0x219392ef | (uint)!bVar55 * auVar79._0_4_;
  bVar55 = (bool)((byte)(uVar57 >> 1) & 1);
  auVar63._4_4_ = (uint)bVar55 * 0x219392ef | (uint)!bVar55 * auVar79._4_4_;
  bVar55 = (bool)((byte)(uVar57 >> 2) & 1);
  auVar63._8_4_ = (uint)bVar55 * 0x219392ef | (uint)!bVar55 * auVar79._8_4_;
  bVar55 = (bool)((byte)(uVar57 >> 3) & 1);
  auVar63._12_4_ = (uint)bVar55 * 0x219392ef | (uint)!bVar55 * auVar79._12_4_;
  auVar59 = vandps_avx512vl(auVar78,auVar58);
  uVar57 = vcmpps_avx512vl(auVar59,auVar207,1);
  bVar55 = (bool)((byte)uVar57 & 1);
  auVar64._0_4_ = (uint)bVar55 * 0x219392ef | (uint)!bVar55 * auVar78._0_4_;
  bVar55 = (bool)((byte)(uVar57 >> 1) & 1);
  auVar64._4_4_ = (uint)bVar55 * 0x219392ef | (uint)!bVar55 * auVar78._4_4_;
  bVar55 = (bool)((byte)(uVar57 >> 2) & 1);
  auVar64._8_4_ = (uint)bVar55 * 0x219392ef | (uint)!bVar55 * auVar78._8_4_;
  bVar55 = (bool)((byte)(uVar57 >> 3) & 1);
  auVar64._12_4_ = (uint)bVar55 * 0x219392ef | (uint)!bVar55 * auVar78._12_4_;
  auVar58 = vandps_avx512vl(auVar80,auVar58);
  uVar57 = vcmpps_avx512vl(auVar58,auVar207,1);
  bVar55 = (bool)((byte)uVar57 & 1);
  auVar65._0_4_ = (uint)bVar55 * 0x219392ef | (uint)!bVar55 * auVar80._0_4_;
  bVar55 = (bool)((byte)(uVar57 >> 1) & 1);
  auVar65._4_4_ = (uint)bVar55 * 0x219392ef | (uint)!bVar55 * auVar80._4_4_;
  bVar55 = (bool)((byte)(uVar57 >> 2) & 1);
  auVar65._8_4_ = (uint)bVar55 * 0x219392ef | (uint)!bVar55 * auVar80._8_4_;
  bVar55 = (bool)((byte)(uVar57 >> 3) & 1);
  auVar65._12_4_ = (uint)bVar55 * 0x219392ef | (uint)!bVar55 * auVar80._12_4_;
  auVar59 = vrcp14ps_avx512vl(auVar63);
  auVar208._8_4_ = 0x3f800000;
  auVar208._0_8_ = &DAT_3f8000003f800000;
  auVar208._12_4_ = 0x3f800000;
  auVar58 = vfnmadd213ps_fma(auVar63,auVar59,auVar208);
  auVar79 = vfmadd132ps_fma(auVar58,auVar59,auVar59);
  auVar59 = vrcp14ps_avx512vl(auVar64);
  auVar58 = vfnmadd213ps_fma(auVar64,auVar59,auVar208);
  auVar80 = vfmadd132ps_fma(auVar58,auVar59,auVar59);
  auVar59 = vrcp14ps_avx512vl(auVar65);
  auVar58 = vfnmadd213ps_fma(auVar65,auVar59,auVar208);
  auVar23 = vfmadd132ps_fma(auVar58,auVar59,auVar59);
  fVar118 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar51 + 0x16)) *
            *(float *)(prim + lVar51 + 0x1a);
  auVar195._4_4_ = fVar118;
  auVar195._0_4_ = fVar118;
  auVar195._8_4_ = fVar118;
  auVar195._12_4_ = fVar118;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = *(ulong *)(prim + uVar47 * 7 + 6);
  auVar58 = vpmovsxwd_avx(auVar58);
  auVar58 = vcvtdq2ps_avx(auVar58);
  auVar59._8_8_ = 0;
  auVar59._0_8_ = *(ulong *)(prim + uVar47 * 0xb + 6);
  auVar59 = vpmovsxwd_avx(auVar59);
  auVar59 = vcvtdq2ps_avx(auVar59);
  auVar67 = vsubps_avx(auVar59,auVar58);
  auVar68._8_8_ = 0;
  auVar68._0_8_ = *(ulong *)(prim + uVar47 * 9 + 6);
  auVar59 = vpmovsxwd_avx(auVar68);
  auVar68 = vfmadd213ps_fma(auVar67,auVar195,auVar58);
  auVar58 = vcvtdq2ps_avx(auVar59);
  auVar67._8_8_ = 0;
  auVar67._0_8_ = *(ulong *)(prim + uVar47 * 0xd + 6);
  auVar59 = vpmovsxwd_avx(auVar67);
  auVar59 = vcvtdq2ps_avx(auVar59);
  auVar59 = vsubps_avx(auVar59,auVar58);
  auVar67 = vfmadd213ps_fma(auVar59,auVar195,auVar58);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar47 * 0x12 + 6);
  auVar58 = vpmovsxwd_avx(auVar74);
  auVar58 = vcvtdq2ps_avx(auVar58);
  uVar57 = (ulong)(uint)((int)(uVar47 * 5) << 2);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)(prim + uVar47 * 2 + uVar57 + 6);
  auVar59 = vpmovsxwd_avx(auVar71);
  auVar59 = vcvtdq2ps_avx(auVar59);
  auVar59 = vsubps_avx(auVar59,auVar58);
  auVar74 = vfmadd213ps_fma(auVar59,auVar195,auVar58);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar57 + 6);
  auVar58 = vpmovsxwd_avx(auVar72);
  auVar58 = vcvtdq2ps_avx(auVar58);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar47 * 0x18 + 6);
  auVar59 = vpmovsxwd_avx(auVar73);
  auVar59 = vcvtdq2ps_avx(auVar59);
  auVar59 = vsubps_avx(auVar59,auVar58);
  auVar71 = vfmadd213ps_fma(auVar59,auVar195,auVar58);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar47 * 0x1d + 6);
  auVar58 = vpmovsxwd_avx(auVar75);
  auVar58 = vcvtdq2ps_avx(auVar58);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar47 + (ulong)(byte)PVar5 * 0x20 + 6);
  auVar59 = vpmovsxwd_avx(auVar76);
  auVar59 = vcvtdq2ps_avx(auVar59);
  auVar59 = vsubps_avx(auVar59,auVar58);
  auVar72 = vfmadd213ps_fma(auVar59,auVar195,auVar58);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar5 * 0x20 - uVar47) + 6);
  auVar58 = vpmovsxwd_avx(auVar77);
  auVar58 = vcvtdq2ps_avx(auVar58);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar47 * 0x23 + 6);
  auVar59 = vpmovsxwd_avx(auVar78);
  auVar59 = vcvtdq2ps_avx(auVar59);
  auVar59 = vsubps_avx(auVar59,auVar58);
  auVar59 = vfmadd213ps_fma(auVar59,auVar195,auVar58);
  auVar58 = vsubps_avx(auVar68,auVar60);
  auVar196._0_4_ = auVar79._0_4_ * auVar58._0_4_;
  auVar196._4_4_ = auVar79._4_4_ * auVar58._4_4_;
  auVar196._8_4_ = auVar79._8_4_ * auVar58._8_4_;
  auVar196._12_4_ = auVar79._12_4_ * auVar58._12_4_;
  auVar58 = vsubps_avx(auVar67,auVar60);
  auVar81._0_4_ = auVar79._0_4_ * auVar58._0_4_;
  auVar81._4_4_ = auVar79._4_4_ * auVar58._4_4_;
  auVar81._8_4_ = auVar79._8_4_ * auVar58._8_4_;
  auVar81._12_4_ = auVar79._12_4_ * auVar58._12_4_;
  auVar58 = vsubps_avx(auVar74,auVar61);
  auVar179._0_4_ = auVar80._0_4_ * auVar58._0_4_;
  auVar179._4_4_ = auVar80._4_4_ * auVar58._4_4_;
  auVar179._8_4_ = auVar80._8_4_ * auVar58._8_4_;
  auVar179._12_4_ = auVar80._12_4_ * auVar58._12_4_;
  auVar58 = vsubps_avx(auVar71,auVar61);
  auVar70._0_4_ = auVar80._0_4_ * auVar58._0_4_;
  auVar70._4_4_ = auVar80._4_4_ * auVar58._4_4_;
  auVar70._8_4_ = auVar80._8_4_ * auVar58._8_4_;
  auVar70._12_4_ = auVar80._12_4_ * auVar58._12_4_;
  auVar58 = vsubps_avx(auVar72,auVar62);
  auVar84._0_4_ = auVar23._0_4_ * auVar58._0_4_;
  auVar84._4_4_ = auVar23._4_4_ * auVar58._4_4_;
  auVar84._8_4_ = auVar23._8_4_ * auVar58._8_4_;
  auVar84._12_4_ = auVar23._12_4_ * auVar58._12_4_;
  auVar58 = vsubps_avx(auVar59,auVar62);
  auVar66._0_4_ = auVar23._0_4_ * auVar58._0_4_;
  auVar66._4_4_ = auVar23._4_4_ * auVar58._4_4_;
  auVar66._8_4_ = auVar23._8_4_ * auVar58._8_4_;
  auVar66._12_4_ = auVar23._12_4_ * auVar58._12_4_;
  auVar58 = vpminsd_avx(auVar196,auVar81);
  auVar59 = vpminsd_avx(auVar179,auVar70);
  auVar58 = vmaxps_avx(auVar58,auVar59);
  auVar59 = vpminsd_avx(auVar84,auVar66);
  uVar119 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar79._4_4_ = uVar119;
  auVar79._0_4_ = uVar119;
  auVar79._8_4_ = uVar119;
  auVar79._12_4_ = uVar119;
  auVar59 = vmaxps_avx512vl(auVar59,auVar79);
  auVar58 = vmaxps_avx(auVar58,auVar59);
  auVar80._8_4_ = 0x3f7ffffa;
  auVar80._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar80._12_4_ = 0x3f7ffffa;
  local_3a0 = vmulps_avx512vl(auVar58,auVar80);
  auVar58 = vpmaxsd_avx(auVar196,auVar81);
  auVar59 = vpmaxsd_avx(auVar179,auVar70);
  auVar58 = vminps_avx(auVar58,auVar59);
  auVar59 = vpmaxsd_avx(auVar84,auVar66);
  uVar119 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar23._4_4_ = uVar119;
  auVar23._0_4_ = uVar119;
  auVar23._8_4_ = uVar119;
  auVar23._12_4_ = uVar119;
  auVar59 = vminps_avx512vl(auVar59,auVar23);
  auVar58 = vminps_avx(auVar58,auVar59);
  auVar60._8_4_ = 0x3f800003;
  auVar60._0_8_ = 0x3f8000033f800003;
  auVar60._12_4_ = 0x3f800003;
  auVar58 = vmulps_avx512vl(auVar58,auVar60);
  auVar59 = vpbroadcastd_avx512vl();
  uVar20 = vcmpps_avx512vl(local_3a0,auVar58,2);
  uVar57 = vpcmpgtd_avx512vl(auVar59,_DAT_01ff0cf0);
  uVar57 = ((byte)uVar20 & 0xf) & uVar57;
  bVar55 = (char)uVar57 == '\0';
  local_5a1 = !bVar55;
  if (bVar55) {
    return local_5a1;
  }
  local_240 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar58 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
  auVar304 = ZEXT1664(auVar58);
LAB_01c607f7:
  lVar51 = 0;
  for (uVar47 = uVar57; (uVar47 & 1) == 0; uVar47 = uVar47 >> 1 | 0x8000000000000000) {
    lVar51 = lVar51 + 1;
  }
  uVar54 = *(uint *)(prim + 2);
  pGVar7 = (context->scene->geometries).items[uVar54].ptr;
  fVar118 = (pGVar7->time_range).lower;
  fVar118 = pGVar7->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar118) / ((pGVar7->time_range).upper - fVar118));
  auVar58 = vroundss_avx(ZEXT416((uint)fVar118),ZEXT416((uint)fVar118),9);
  auVar58 = vminss_avx(auVar58,ZEXT416((uint)(pGVar7->fnumTimeSegments + -1.0)));
  auVar60 = vmaxss_avx512f(auVar304._0_16_,auVar58);
  uVar47 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           (ulong)*(uint *)(prim + lVar51 * 4 + 6) *
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var8 = pGVar7[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar53 = (long)(int)auVar60._0_4_ * 0x38;
  lVar9 = *(long *)(_Var8 + lVar53);
  lVar10 = *(long *)(_Var8 + 0x10 + lVar53);
  auVar58 = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar47);
  lVar51 = uVar47 + 1;
  auVar59 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar51);
  lVar1 = uVar47 + 2;
  auVar68 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar1);
  lVar2 = uVar47 + 3;
  auVar67 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar2);
  lVar9 = *(long *)&pGVar7[4].fnumTimeSegments;
  lVar10 = *(long *)(lVar9 + lVar53);
  lVar11 = *(long *)(lVar9 + 0x10 + lVar53);
  auVar74 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar47);
  auVar71 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar51);
  auVar72 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  auVar73 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar2);
  lVar10 = *(long *)(_Var8 + 0x38 + lVar53);
  lVar11 = *(long *)(_Var8 + 0x48 + lVar53);
  auVar75 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar47);
  auVar76 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar51);
  auVar77 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  auVar78 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar2);
  local_200 = vpbroadcastd_avx512vl();
  lVar10 = *(long *)(lVar9 + 0x38 + lVar53);
  lVar9 = *(long *)(lVar9 + 0x48 + lVar53);
  auVar79 = *(undefined1 (*) [16])(lVar10 + uVar47 * lVar9);
  auVar80 = *(undefined1 (*) [16])(lVar10 + lVar51 * lVar9);
  auVar23 = *(undefined1 (*) [16])(lVar10 + lVar1 * lVar9);
  auVar103._16_16_ = local_200._16_16_;
  auVar60 = vsubss_avx512f(ZEXT416((uint)fVar118),auVar60);
  auVar103._0_16_ = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
  auVar61 = vmulps_avx512vl(auVar67,auVar103._0_16_);
  auVar125._8_4_ = 0x3e2aaaab;
  auVar125._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar125._12_4_ = 0x3e2aaaab;
  auVar62 = vfmadd213ps_avx512vl(auVar125,auVar68,auVar61);
  auVar63 = vbroadcastss_avx512vl(ZEXT416(0x3f2aaaab));
  auVar62 = vfmadd231ps_avx512vl(auVar62,auVar59,auVar63);
  auVar62 = vfmadd231ps_avx512vl(auVar62,auVar58,auVar125);
  auVar24._8_4_ = 0x3f000000;
  auVar24._0_8_ = 0x3f0000003f000000;
  auVar24._12_4_ = 0x3f000000;
  auVar61 = vfmadd231ps_avx512vl(auVar61,auVar68,auVar24);
  auVar61 = vfnmadd231ps_avx512vl(auVar61,auVar59,auVar103._0_16_);
  auVar25._8_4_ = 0x3f000000;
  auVar25._0_8_ = 0x3f0000003f000000;
  auVar25._12_4_ = 0x3f000000;
  auVar61 = vfnmadd231ps_avx512vl(auVar61,auVar58,auVar25);
  auVar64 = vmulps_avx512vl(auVar73,auVar103._0_16_);
  auVar65 = vfmadd213ps_avx512vl(auVar125,auVar72,auVar64);
  auVar65 = vfmadd231ps_avx512vl(auVar65,auVar71,auVar63);
  auVar65 = vfmadd231ps_avx512vl(auVar65,auVar74,auVar125);
  auVar26._8_4_ = 0x3f000000;
  auVar26._0_8_ = 0x3f0000003f000000;
  auVar26._12_4_ = 0x3f000000;
  auVar64 = vfmadd231ps_avx512vl(auVar64,auVar72,auVar26);
  auVar64 = vfnmadd231ps_avx512vl(auVar64,auVar71,auVar103._0_16_);
  auVar27._8_4_ = 0x3f000000;
  auVar27._0_8_ = 0x3f0000003f000000;
  auVar27._12_4_ = 0x3f000000;
  auVar64 = vfnmadd231ps_avx512vl(auVar64,auVar74,auVar27);
  auVar66 = vmulps_avx512vl(auVar67,auVar125);
  auVar66 = vfmadd231ps_avx512vl(auVar66,auVar68,auVar63);
  auVar66 = vfmadd231ps_avx512vl(auVar66,auVar59,auVar125);
  auVar66 = vfmadd231ps_avx512vl(auVar66,auVar58,auVar103._0_16_);
  auVar28._8_4_ = 0x3f000000;
  auVar28._0_8_ = 0x3f0000003f000000;
  auVar28._12_4_ = 0x3f000000;
  auVar67 = vmulps_avx512vl(auVar67,auVar28);
  auVar68 = vfmadd231ps_avx512vl(auVar67,auVar103._0_16_,auVar68);
  auVar29._8_4_ = 0x3f000000;
  auVar29._0_8_ = 0x3f0000003f000000;
  auVar29._12_4_ = 0x3f000000;
  auVar59 = vfnmadd231ps_avx512vl(auVar68,auVar59,auVar29);
  auVar69 = vfnmadd231ps_avx512vl(auVar59,auVar103._0_16_,auVar58);
  auVar120._0_4_ = auVar73._0_4_ * 0.16666667;
  auVar120._4_4_ = auVar73._4_4_ * 0.16666667;
  auVar120._8_4_ = auVar73._8_4_ * 0.16666667;
  auVar120._12_4_ = auVar73._12_4_ * 0.16666667;
  auVar58 = vfmadd231ps_avx512vl(auVar120,auVar72,auVar63);
  auVar58 = vfmadd231ps_fma(auVar58,auVar71,auVar125);
  auVar70 = vfmadd231ps_avx512vl(auVar58,auVar74,auVar103._0_16_);
  auVar30._8_4_ = 0x3f000000;
  auVar30._0_8_ = 0x3f0000003f000000;
  auVar30._12_4_ = 0x3f000000;
  auVar58 = vmulps_avx512vl(auVar73,auVar30);
  auVar58 = vfmadd231ps_avx512vl(auVar58,auVar103._0_16_,auVar72);
  auVar31._8_4_ = 0x3f000000;
  auVar31._0_8_ = 0x3f0000003f000000;
  auVar31._12_4_ = 0x3f000000;
  auVar58 = vfnmadd231ps_avx512vl(auVar58,auVar71,auVar31);
  auVar71 = vfnmadd231ps_avx512vl(auVar58,auVar103._0_16_,auVar74);
  auVar58 = vshufps_avx(auVar61,auVar61,0xc9);
  auVar59 = vshufps_avx512vl(auVar65,auVar65,0xc9);
  fVar147 = auVar61._0_4_;
  auVar180._0_4_ = fVar147 * auVar59._0_4_;
  fVar165 = auVar61._4_4_;
  auVar180._4_4_ = fVar165 * auVar59._4_4_;
  fVar166 = auVar61._8_4_;
  auVar180._8_4_ = fVar166 * auVar59._8_4_;
  fVar167 = auVar61._12_4_;
  auVar180._12_4_ = fVar167 * auVar59._12_4_;
  auVar59 = vfmsub231ps_avx512vl(auVar180,auVar58,auVar65);
  auVar68 = vshufps_avx(auVar59,auVar59,0xc9);
  auVar59 = vshufps_avx512vl(auVar64,auVar64,0xc9);
  auVar197._0_4_ = fVar147 * auVar59._0_4_;
  auVar197._4_4_ = fVar165 * auVar59._4_4_;
  auVar197._8_4_ = fVar166 * auVar59._8_4_;
  auVar197._12_4_ = fVar167 * auVar59._12_4_;
  auVar58 = vfmsub231ps_avx512vl(auVar197,auVar58,auVar64);
  auVar67 = vshufps_avx(auVar58,auVar58,0xc9);
  auVar58 = vshufps_avx(auVar69,auVar69,0xc9);
  auVar59 = vshufps_avx(auVar70,auVar70,0xc9);
  fVar124 = auVar69._0_4_;
  auVar224._0_4_ = auVar59._0_4_ * fVar124;
  fVar263 = auVar69._4_4_;
  auVar224._4_4_ = auVar59._4_4_ * fVar263;
  fVar247 = auVar69._8_4_;
  auVar224._8_4_ = auVar59._8_4_ * fVar247;
  fVar258 = auVar69._12_4_;
  auVar224._12_4_ = auVar59._12_4_ * fVar258;
  auVar59 = vfmsub231ps_fma(auVar224,auVar58,auVar70);
  auVar74 = vshufps_avx(auVar59,auVar59,0xc9);
  auVar59 = vshufps_avx(auVar71,auVar71,0xc9);
  auVar225._0_4_ = auVar59._0_4_ * fVar124;
  auVar225._4_4_ = auVar59._4_4_ * fVar263;
  auVar225._8_4_ = auVar59._8_4_ * fVar247;
  auVar225._12_4_ = auVar59._12_4_ * fVar258;
  auVar58 = vfmsub231ps_fma(auVar225,auVar58,auVar71);
  auVar71 = vshufps_avx(auVar58,auVar58,0xc9);
  auVar58 = vdpps_avx(auVar68,auVar68,0x7f);
  auVar99._4_28_ = auVar103._4_28_;
  auVar99._0_4_ = auVar58._0_4_;
  auVar59 = vrsqrt14ss_avx512f(auVar103._0_16_,auVar99._0_16_);
  auVar72 = vmulss_avx512f(auVar59,ZEXT416(0x3fc00000));
  auVar73 = vmulss_avx512f(auVar58,ZEXT416(0xbf000000));
  auVar73 = vmulss_avx512f(auVar73,auVar59);
  auVar59 = vmulss_avx512f(auVar73,ZEXT416((uint)(auVar59._0_4_ * auVar59._0_4_)));
  auVar59 = vaddss_avx512f(auVar72,auVar59);
  auVar236._0_4_ = auVar59._0_4_;
  auVar236._4_4_ = auVar236._0_4_;
  auVar236._8_4_ = auVar236._0_4_;
  auVar236._12_4_ = auVar236._0_4_;
  auVar72 = vmulps_avx512vl(auVar68,auVar236);
  auVar59 = vdpps_avx(auVar68,auVar67,0x7f);
  auVar73 = vbroadcastss_avx512vl(auVar58);
  auVar67 = vmulps_avx512vl(auVar73,auVar67);
  fVar118 = auVar59._0_4_;
  auVar181._0_4_ = fVar118 * auVar68._0_4_;
  auVar181._4_4_ = fVar118 * auVar68._4_4_;
  auVar181._8_4_ = fVar118 * auVar68._8_4_;
  auVar181._12_4_ = fVar118 * auVar68._12_4_;
  auVar68 = vsubps_avx(auVar67,auVar181);
  auVar59 = vrcp14ss_avx512f(auVar103._0_16_,auVar99._0_16_);
  auVar58 = vfnmadd213ss_avx512f(auVar58,auVar59,ZEXT416(0x40000000));
  fVar259 = auVar59._0_4_ * auVar58._0_4_;
  auVar58 = vdpps_avx(auVar74,auVar74,0x7f);
  auVar85._16_16_ = auVar103._16_16_;
  auVar85._0_16_ = auVar103._0_16_;
  auVar101._4_28_ = auVar85._4_28_;
  auVar101._0_4_ = auVar58._0_4_;
  auVar59 = vrsqrt14ss_avx512f(auVar103._0_16_,auVar101._0_16_);
  auVar67 = vmulss_avx512f(auVar59,ZEXT416(0x3fc00000));
  auVar73 = vmulss_avx512f(auVar58,ZEXT416(0xbf000000));
  fVar118 = auVar59._0_4_;
  fVar118 = auVar67._0_4_ + auVar73._0_4_ * fVar118 * fVar118 * fVar118;
  auVar237._0_4_ = fVar118 * auVar74._0_4_;
  auVar237._4_4_ = fVar118 * auVar74._4_4_;
  auVar237._8_4_ = fVar118 * auVar74._8_4_;
  auVar237._12_4_ = fVar118 * auVar74._12_4_;
  auVar59 = vdpps_avx(auVar74,auVar71,0x7f);
  auVar67 = vbroadcastss_avx512vl(auVar58);
  auVar67 = vmulps_avx512vl(auVar67,auVar71);
  fVar148 = auVar59._0_4_;
  auVar121._0_4_ = fVar148 * auVar74._0_4_;
  auVar121._4_4_ = fVar148 * auVar74._4_4_;
  auVar121._8_4_ = fVar148 * auVar74._8_4_;
  auVar121._12_4_ = fVar148 * auVar74._12_4_;
  auVar59 = vsubps_avx(auVar67,auVar121);
  auVar67 = vrcp14ss_avx512f(auVar103._0_16_,auVar101._0_16_);
  auVar58 = vfnmadd213ss_avx512f(auVar58,auVar67,ZEXT416(0x40000000));
  fVar148 = auVar67._0_4_ * auVar58._0_4_;
  auVar67 = vshufps_avx512vl(auVar62,auVar62,0xff);
  auVar74 = vmulps_avx512vl(auVar67,auVar72);
  auVar73 = vsubps_avx512vl(auVar62,auVar74);
  auVar58 = vshufps_avx(auVar61,auVar61,0xff);
  auVar58 = vmulps_avx512vl(auVar58,auVar72);
  auVar169._0_4_ = auVar58._0_4_ + auVar67._0_4_ * auVar236._0_4_ * fVar259 * auVar68._0_4_;
  auVar169._4_4_ = auVar58._4_4_ + auVar67._4_4_ * auVar236._0_4_ * fVar259 * auVar68._4_4_;
  auVar169._8_4_ = auVar58._8_4_ + auVar67._8_4_ * auVar236._0_4_ * fVar259 * auVar68._8_4_;
  auVar169._12_4_ = auVar58._12_4_ + auVar67._12_4_ * auVar236._0_4_ * fVar259 * auVar68._12_4_;
  auVar58 = vsubps_avx(auVar61,auVar169);
  auVar72 = vaddps_avx512vl(auVar62,auVar74);
  auVar68 = vshufps_avx512vl(auVar66,auVar66,0xff);
  auVar279._0_4_ = auVar237._0_4_ * auVar68._0_4_;
  auVar279._4_4_ = auVar237._4_4_ * auVar68._4_4_;
  auVar279._8_4_ = auVar237._8_4_ * auVar68._8_4_;
  auVar279._12_4_ = auVar237._12_4_ * auVar68._12_4_;
  auVar61 = vsubps_avx512vl(auVar66,auVar279);
  auVar67 = vshufps_avx512vl(auVar69,auVar69,0xff);
  auVar67 = vmulps_avx512vl(auVar67,auVar237);
  auVar182._0_4_ = auVar67._0_4_ + auVar68._0_4_ * fVar118 * auVar59._0_4_ * fVar148;
  auVar182._4_4_ = auVar67._4_4_ + auVar68._4_4_ * fVar118 * auVar59._4_4_ * fVar148;
  auVar182._8_4_ = auVar67._8_4_ + auVar68._8_4_ * fVar118 * auVar59._8_4_ * fVar148;
  auVar182._12_4_ = auVar67._12_4_ + auVar68._12_4_ * fVar118 * auVar59._12_4_ * fVar148;
  auVar59 = vsubps_avx(auVar69,auVar182);
  auVar62 = vaddps_avx512vl(auVar66,auVar279);
  auVar209._0_4_ = auVar73._0_4_ + auVar58._0_4_ * 0.33333334;
  auVar209._4_4_ = auVar73._4_4_ + auVar58._4_4_ * 0.33333334;
  auVar209._8_4_ = auVar73._8_4_ + auVar58._8_4_ * 0.33333334;
  auVar209._12_4_ = auVar73._12_4_ + auVar58._12_4_ * 0.33333334;
  auVar183._0_4_ = auVar59._0_4_ * 0.33333334;
  auVar183._4_4_ = auVar59._4_4_ * 0.33333334;
  auVar183._8_4_ = auVar59._8_4_ * 0.33333334;
  auVar183._12_4_ = auVar59._12_4_ * 0.33333334;
  auVar74 = vsubps_avx(auVar61,auVar183);
  auVar184._0_4_ = (fVar147 + auVar169._0_4_) * 0.33333334;
  auVar184._4_4_ = (fVar165 + auVar169._4_4_) * 0.33333334;
  auVar184._8_4_ = (fVar166 + auVar169._8_4_) * 0.33333334;
  auVar184._12_4_ = (fVar167 + auVar169._12_4_) * 0.33333334;
  auVar64 = vaddps_avx512vl(auVar72,auVar184);
  auVar198._0_4_ = (fVar124 + auVar182._0_4_) * 0.33333334;
  auVar198._4_4_ = (fVar263 + auVar182._4_4_) * 0.33333334;
  auVar198._8_4_ = (fVar247 + auVar182._8_4_) * 0.33333334;
  auVar198._12_4_ = (fVar258 + auVar182._12_4_) * 0.33333334;
  auVar71 = vsubps_avx(auVar62,auVar198);
  auVar58 = *(undefined1 (*) [16])(lVar10 + lVar9 * lVar2);
  auVar59 = vmulps_avx512vl(auVar78,auVar103._0_16_);
  auVar68 = vfmadd213ps_avx512vl(auVar125,auVar77,auVar59);
  auVar68 = vfmadd231ps_avx512vl(auVar68,auVar76,auVar63);
  auVar65 = vfmadd231ps_avx512vl(auVar68,auVar75,auVar125);
  auVar32._8_4_ = 0x3f000000;
  auVar32._0_8_ = 0x3f0000003f000000;
  auVar32._12_4_ = 0x3f000000;
  auVar59 = vfmadd231ps_avx512vl(auVar59,auVar77,auVar32);
  auVar59 = vfnmadd231ps_avx512vl(auVar59,auVar76,auVar103._0_16_);
  auVar33._8_4_ = 0x3f000000;
  auVar33._0_8_ = 0x3f0000003f000000;
  auVar33._12_4_ = 0x3f000000;
  auVar66 = vfnmadd231ps_avx512vl(auVar59,auVar75,auVar33);
  auVar59 = vmulps_avx512vl(auVar58,auVar103._0_16_);
  auVar68 = vfmadd213ps_avx512vl(auVar125,auVar23,auVar59);
  auVar68 = vfmadd231ps_avx512vl(auVar68,auVar80,auVar63);
  auVar68 = vfmadd231ps_avx512vl(auVar68,auVar79,auVar125);
  auVar34._8_4_ = 0x3f000000;
  auVar34._0_8_ = 0x3f0000003f000000;
  auVar34._12_4_ = 0x3f000000;
  auVar59 = vfmadd231ps_avx512vl(auVar59,auVar23,auVar34);
  auVar59 = vfnmadd231ps_avx512vl(auVar59,auVar80,auVar103._0_16_);
  auVar35._8_4_ = 0x3f000000;
  auVar35._0_8_ = 0x3f0000003f000000;
  auVar35._12_4_ = 0x3f000000;
  auVar67 = vfnmadd231ps_avx512vl(auVar59,auVar79,auVar35);
  auVar59 = vmulps_avx512vl(auVar78,auVar125);
  auVar59 = vfmadd231ps_avx512vl(auVar59,auVar77,auVar63);
  auVar59 = vfmadd231ps_avx512vl(auVar59,auVar76,auVar125);
  auVar69 = vfmadd231ps_avx512vl(auVar59,auVar75,auVar103._0_16_);
  auVar36._8_4_ = 0x3f000000;
  auVar36._0_8_ = 0x3f0000003f000000;
  auVar36._12_4_ = 0x3f000000;
  auVar59 = vmulps_avx512vl(auVar78,auVar36);
  auVar59 = vfmadd231ps_avx512vl(auVar59,auVar103._0_16_,auVar77);
  auVar37._8_4_ = 0x3f000000;
  auVar37._0_8_ = 0x3f0000003f000000;
  auVar37._12_4_ = 0x3f000000;
  auVar59 = vfnmadd231ps_avx512vl(auVar59,auVar76,auVar37);
  auVar75 = vfnmadd231ps_avx512vl(auVar59,auVar103._0_16_,auVar75);
  auVar59 = vmulps_avx512vl(auVar58,auVar125);
  auVar59 = vfmadd231ps_avx512vl(auVar59,auVar23,auVar63);
  auVar76 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar302 = ZEXT1664(auVar76);
  auVar59 = vfmadd231ps_fma(auVar59,auVar80,auVar125);
  auVar77 = vfmadd231ps_avx512vl(auVar59,auVar79,auVar103._0_16_);
  auVar58 = vmulps_avx512vl(auVar58,auVar76);
  auVar58 = vfmadd231ps_avx512vl(auVar58,auVar103._0_16_,auVar23);
  auVar58 = vfnmadd231ps_avx512vl(auVar58,auVar76,auVar80);
  auVar76 = vfnmadd231ps_avx512vl(auVar58,auVar103._0_16_,auVar79);
  auVar58 = vshufps_avx(auVar66,auVar66,0xc9);
  auVar59 = vshufps_avx512vl(auVar68,auVar68,0xc9);
  fVar263 = auVar66._0_4_;
  auVar286._0_4_ = fVar263 * auVar59._0_4_;
  fVar247 = auVar66._4_4_;
  auVar286._4_4_ = fVar247 * auVar59._4_4_;
  fVar258 = auVar66._8_4_;
  auVar286._8_4_ = fVar258 * auVar59._8_4_;
  fVar259 = auVar66._12_4_;
  auVar286._12_4_ = fVar259 * auVar59._12_4_;
  auVar59 = vfmsub231ps_avx512vl(auVar286,auVar58,auVar68);
  auVar68 = vshufps_avx(auVar59,auVar59,0xc9);
  auVar59 = vshufps_avx512vl(auVar67,auVar67,0xc9);
  auVar293._0_4_ = fVar263 * auVar59._0_4_;
  auVar293._4_4_ = fVar247 * auVar59._4_4_;
  auVar293._8_4_ = fVar258 * auVar59._8_4_;
  auVar293._12_4_ = fVar259 * auVar59._12_4_;
  auVar58 = vfmsub231ps_avx512vl(auVar293,auVar58,auVar67);
  auVar67 = vshufps_avx(auVar58,auVar58,0xc9);
  auVar59 = vshufps_avx(auVar75,auVar75,0xc9);
  auVar58 = vshufps_avx512vl(auVar77,auVar77,0xc9);
  auVar58 = vmulps_avx512vl(auVar75,auVar58);
  auVar58 = vfmsub231ps_avx512vl(auVar58,auVar59,auVar77);
  auVar77 = vshufps_avx512vl(auVar58,auVar58,0xc9);
  auVar78 = vshufps_avx512vl(auVar76,auVar76,0xc9);
  auVar58 = vdpps_avx(auVar68,auVar68,0x7f);
  auVar78 = vmulps_avx512vl(auVar75,auVar78);
  auVar59 = vfmsub231ps_avx512vl(auVar78,auVar59,auVar76);
  auVar76 = vshufps_avx512vl(auVar59,auVar59,0xc9);
  auVar102._16_16_ = auVar103._16_16_;
  auVar102._0_16_ = auVar103._0_16_;
  auVar86._4_28_ = auVar102._4_28_;
  auVar86._0_4_ = auVar58._0_4_;
  auVar59 = vrsqrt14ss_avx512f(auVar103._0_16_,auVar86._0_16_);
  auVar78 = vmulss_avx512f(auVar59,ZEXT416(0x3fc00000));
  auVar79 = vmulss_avx512f(auVar58,ZEXT416(0xbf000000));
  auVar79 = vmulss_avx512f(auVar79,auVar59);
  auVar59 = vmulss_avx512f(auVar59,auVar59);
  auVar59 = vmulss_avx512f(auVar79,auVar59);
  auVar59 = vaddss_avx512f(auVar78,auVar59);
  auVar78 = vbroadcastss_avx512vl(auVar59);
  auVar79 = vmulps_avx512vl(auVar68,auVar78);
  auVar59 = vdpps_avx(auVar68,auVar67,0x7f);
  auVar80 = vbroadcastss_avx512vl(auVar58);
  auVar67 = vmulps_avx512vl(auVar80,auVar67);
  fVar118 = auVar59._0_4_;
  auVar185._0_4_ = auVar68._0_4_ * fVar118;
  auVar185._4_4_ = auVar68._4_4_ * fVar118;
  auVar185._8_4_ = auVar68._8_4_ * fVar118;
  auVar185._12_4_ = auVar68._12_4_ * fVar118;
  auVar59 = vsubps_avx(auVar67,auVar185);
  auVar68 = vrcp14ss_avx512f(auVar103._0_16_,auVar86._0_16_);
  auVar58 = vfnmadd213ss_avx512f(auVar58,auVar68,ZEXT416(0x40000000));
  fVar118 = auVar68._0_4_ * auVar58._0_4_;
  auVar58 = vdpps_avx(auVar77,auVar77,0x7f);
  auVar126._0_4_ = fVar118 * auVar59._0_4_;
  auVar126._4_4_ = fVar118 * auVar59._4_4_;
  auVar126._8_4_ = fVar118 * auVar59._8_4_;
  auVar126._12_4_ = fVar118 * auVar59._12_4_;
  auVar68 = vmulps_avx512vl(auVar78,auVar126);
  auVar87._16_16_ = auVar103._16_16_;
  auVar87._0_16_ = auVar103._0_16_;
  auVar88._4_28_ = auVar87._4_28_;
  auVar88._0_4_ = auVar58._0_4_;
  auVar59 = vrsqrt14ss_avx512f(auVar103._0_16_,auVar88._0_16_);
  auVar67 = vmulss_avx512f(auVar59,ZEXT416(0x3fc00000));
  auVar300 = ZEXT464(0x3f800000);
  auVar78 = vmulss_avx512f(auVar58,ZEXT416(0xbf000000));
  auVar78 = vmulss_avx512f(auVar78,auVar59);
  auVar59 = vmulss_avx512f(auVar78,ZEXT416((uint)(auVar59._0_4_ * auVar59._0_4_)));
  fVar118 = auVar67._0_4_ + auVar59._0_4_;
  auVar294._0_4_ = auVar77._0_4_ * fVar118;
  auVar294._4_4_ = auVar77._4_4_ * fVar118;
  auVar294._8_4_ = auVar77._8_4_ * fVar118;
  auVar294._12_4_ = auVar77._12_4_ * fVar118;
  auVar59 = vdpps_avx(auVar77,auVar76,0x7f);
  auVar67 = vbroadcastss_avx512vl(auVar58);
  auVar67 = vmulps_avx512vl(auVar67,auVar76);
  fVar124 = auVar59._0_4_;
  auVar199._0_4_ = auVar77._0_4_ * fVar124;
  auVar199._4_4_ = auVar77._4_4_ * fVar124;
  auVar199._8_4_ = auVar77._8_4_ * fVar124;
  auVar199._12_4_ = auVar77._12_4_ * fVar124;
  auVar59 = vsubps_avx(auVar67,auVar199);
  auVar67 = vrcp14ss_avx512f(auVar103._0_16_,auVar88._0_16_);
  auVar58 = vfnmadd213ss_avx512f(auVar58,auVar67,ZEXT416(0x40000000));
  fVar124 = auVar58._0_4_ * auVar67._0_4_;
  auVar67 = vshufps_avx512vl(auVar65,auVar65,0xff);
  auVar76 = vmulps_avx512vl(auVar67,auVar79);
  auVar77 = vsubps_avx512vl(auVar65,auVar76);
  auVar58 = vshufps_avx(auVar66,auVar66,0xff);
  auVar58 = vmulps_avx512vl(auVar58,auVar79);
  auVar127._0_4_ = auVar58._0_4_ + auVar67._0_4_ * auVar68._0_4_;
  auVar127._4_4_ = auVar58._4_4_ + auVar67._4_4_ * auVar68._4_4_;
  auVar127._8_4_ = auVar58._8_4_ + auVar67._8_4_ * auVar68._8_4_;
  auVar127._12_4_ = auVar58._12_4_ + auVar67._12_4_ * auVar68._12_4_;
  auVar58 = vsubps_avx(auVar66,auVar127);
  auVar68 = vaddps_avx512vl(auVar65,auVar76);
  auVar67 = vshufps_avx512vl(auVar69,auVar69,0xff);
  auVar271._0_4_ = auVar67._0_4_ * auVar294._0_4_;
  auVar271._4_4_ = auVar67._4_4_ * auVar294._4_4_;
  auVar271._8_4_ = auVar67._8_4_ * auVar294._8_4_;
  auVar271._12_4_ = auVar67._12_4_ * auVar294._12_4_;
  auVar76 = vsubps_avx512vl(auVar69,auVar271);
  auVar78 = vshufps_avx512vl(auVar75,auVar75,0xff);
  auVar78 = vmulps_avx512vl(auVar78,auVar294);
  auVar186._0_4_ = auVar78._0_4_ + auVar67._0_4_ * fVar118 * auVar59._0_4_ * fVar124;
  auVar186._4_4_ = auVar78._4_4_ + auVar67._4_4_ * fVar118 * auVar59._4_4_ * fVar124;
  auVar186._8_4_ = auVar78._8_4_ + auVar67._8_4_ * fVar118 * auVar59._8_4_ * fVar124;
  auVar186._12_4_ = auVar78._12_4_ + auVar67._12_4_ * fVar118 * auVar59._12_4_ * fVar124;
  auVar59 = vsubps_avx(auVar75,auVar186);
  auVar67 = vaddps_avx512vl(auVar69,auVar271);
  auVar200._0_4_ = auVar77._0_4_ + auVar58._0_4_ * 0.33333334;
  auVar200._4_4_ = auVar77._4_4_ + auVar58._4_4_ * 0.33333334;
  auVar200._8_4_ = auVar77._8_4_ + auVar58._8_4_ * 0.33333334;
  auVar200._12_4_ = auVar77._12_4_ + auVar58._12_4_ * 0.33333334;
  auVar238._0_4_ = auVar59._0_4_ * 0.33333334;
  auVar238._4_4_ = auVar59._4_4_ * 0.33333334;
  auVar238._8_4_ = auVar59._8_4_ * 0.33333334;
  auVar238._12_4_ = auVar59._12_4_ * 0.33333334;
  auVar58 = vsubps_avx(auVar76,auVar238);
  auVar128._0_4_ = auVar68._0_4_ + (fVar263 + auVar127._0_4_) * 0.33333334;
  auVar128._4_4_ = auVar68._4_4_ + (fVar247 + auVar127._4_4_) * 0.33333334;
  auVar128._8_4_ = auVar68._8_4_ + (fVar258 + auVar127._8_4_) * 0.33333334;
  auVar128._12_4_ = auVar68._12_4_ + (fVar259 + auVar127._12_4_) * 0.33333334;
  auVar187._0_4_ = (auVar75._0_4_ + auVar186._0_4_) * 0.33333334;
  auVar187._4_4_ = (auVar75._4_4_ + auVar186._4_4_) * 0.33333334;
  auVar187._8_4_ = (auVar75._8_4_ + auVar186._8_4_) * 0.33333334;
  auVar187._12_4_ = (auVar75._12_4_ + auVar186._12_4_) * 0.33333334;
  auVar59 = vsubps_avx(auVar67,auVar187);
  auVar75 = vbroadcastss_avx512vl(auVar60);
  auVar78 = vsubss_avx512f(ZEXT416(0x3f800000),auVar60);
  auVar295._0_4_ = auVar78._0_4_;
  auVar295._4_4_ = auVar295._0_4_;
  auVar295._8_4_ = auVar295._0_4_;
  auVar295._12_4_ = auVar295._0_4_;
  auVar77 = vmulps_avx512vl(auVar75,auVar77);
  auVar78 = vmulps_avx512vl(auVar75,auVar200);
  auVar58 = vmulps_avx512vl(auVar75,auVar58);
  auVar287._0_4_ = auVar75._0_4_ * auVar76._0_4_;
  auVar287._4_4_ = auVar75._4_4_ * auVar76._4_4_;
  auVar287._8_4_ = auVar75._8_4_ * auVar76._8_4_;
  auVar287._12_4_ = auVar75._12_4_ * auVar76._12_4_;
  local_320 = vfmadd231ps_avx512vl(auVar77,auVar295,auVar73);
  local_330 = vfmadd231ps_avx512vl(auVar78,auVar295,auVar209);
  local_340 = vfmadd231ps_avx512vl(auVar58,auVar295,auVar74);
  local_350 = vfmadd231ps_fma(auVar287,auVar295,auVar61);
  auVar58 = vmulps_avx512vl(auVar75,auVar68);
  auVar68 = vmulps_avx512vl(auVar75,auVar128);
  auVar59 = vmulps_avx512vl(auVar75,auVar59);
  auVar280._0_4_ = auVar75._0_4_ * auVar67._0_4_;
  auVar280._4_4_ = auVar75._4_4_ * auVar67._4_4_;
  auVar280._8_4_ = auVar75._8_4_ * auVar67._8_4_;
  auVar280._12_4_ = auVar75._12_4_ * auVar67._12_4_;
  _local_360 = vfmadd231ps_avx512vl(auVar58,auVar295,auVar72);
  _local_370 = vfmadd231ps_avx512vl(auVar68,auVar295,auVar64);
  _local_380 = vfmadd231ps_avx512vl(auVar59,auVar295,auVar71);
  _local_390 = vfmadd231ps_fma(auVar280,auVar295,auVar62);
  auVar58 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar58 = vinsertps_avx(auVar58,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  local_2a0 = vsubps_avx512vl(local_320,auVar58);
  uVar119 = local_2a0._0_4_;
  auVar129._4_4_ = uVar119;
  auVar129._0_4_ = uVar119;
  auVar129._8_4_ = uVar119;
  auVar129._12_4_ = uVar119;
  auVar59 = vshufps_avx(local_2a0,local_2a0,0x55);
  auVar68 = vshufps_avx(local_2a0,local_2a0,0xaa);
  aVar3 = pre->ray_space[k].vx.field_0;
  aVar4 = pre->ray_space[k].vy.field_0;
  fVar118 = pre->ray_space[k].vz.field_0.m128[0];
  fVar124 = pre->ray_space[k].vz.field_0.m128[1];
  fVar263 = pre->ray_space[k].vz.field_0.m128[2];
  fVar247 = pre->ray_space[k].vz.field_0.m128[3];
  auVar122._0_4_ = fVar118 * auVar68._0_4_;
  auVar122._4_4_ = fVar124 * auVar68._4_4_;
  auVar122._8_4_ = fVar263 * auVar68._8_4_;
  auVar122._12_4_ = fVar247 * auVar68._12_4_;
  auVar59 = vfmadd231ps_fma(auVar122,(undefined1  [16])aVar4,auVar59);
  auVar73 = vfmadd231ps_fma(auVar59,(undefined1  [16])aVar3,auVar129);
  local_2b0 = vsubps_avx512vl(local_330,auVar58);
  uVar119 = local_2b0._0_4_;
  auVar150._4_4_ = uVar119;
  auVar150._0_4_ = uVar119;
  auVar150._8_4_ = uVar119;
  auVar150._12_4_ = uVar119;
  auVar59 = vshufps_avx(local_2b0,local_2b0,0x55);
  auVar68 = vshufps_avx(local_2b0,local_2b0,0xaa);
  auVar130._0_4_ = fVar118 * auVar68._0_4_;
  auVar130._4_4_ = fVar124 * auVar68._4_4_;
  auVar130._8_4_ = fVar263 * auVar68._8_4_;
  auVar130._12_4_ = fVar247 * auVar68._12_4_;
  auVar59 = vfmadd231ps_fma(auVar130,(undefined1  [16])aVar4,auVar59);
  auVar75 = vfmadd231ps_fma(auVar59,(undefined1  [16])aVar3,auVar150);
  local_2c0 = vsubps_avx512vl(local_340,auVar58);
  uVar119 = local_2c0._0_4_;
  auVar151._4_4_ = uVar119;
  auVar151._0_4_ = uVar119;
  auVar151._8_4_ = uVar119;
  auVar151._12_4_ = uVar119;
  auVar59 = vshufps_avx(local_2c0,local_2c0,0x55);
  auVar68 = vshufps_avx(local_2c0,local_2c0,0xaa);
  auVar226._0_4_ = auVar68._0_4_ * fVar118;
  auVar226._4_4_ = auVar68._4_4_ * fVar124;
  auVar226._8_4_ = auVar68._8_4_ * fVar263;
  auVar226._12_4_ = auVar68._12_4_ * fVar247;
  auVar59 = vfmadd231ps_fma(auVar226,(undefined1  [16])aVar4,auVar59);
  auVar76 = vfmadd231ps_fma(auVar59,(undefined1  [16])aVar3,auVar151);
  local_2d0 = vsubps_avx(local_350,auVar58);
  uVar119 = local_2d0._0_4_;
  auVar152._4_4_ = uVar119;
  auVar152._0_4_ = uVar119;
  auVar152._8_4_ = uVar119;
  auVar152._12_4_ = uVar119;
  auVar59 = vshufps_avx(local_2d0,local_2d0,0x55);
  auVar68 = vshufps_avx(local_2d0,local_2d0,0xaa);
  auVar239._0_4_ = auVar68._0_4_ * fVar118;
  auVar239._4_4_ = auVar68._4_4_ * fVar124;
  auVar239._8_4_ = auVar68._8_4_ * fVar263;
  auVar239._12_4_ = auVar68._12_4_ * fVar247;
  auVar59 = vfmadd231ps_fma(auVar239,(undefined1  [16])aVar4,auVar59);
  auVar77 = vfmadd231ps_fma(auVar59,(undefined1  [16])aVar3,auVar152);
  local_2e0 = vsubps_avx512vl(_local_360,auVar58);
  uVar119 = local_2e0._0_4_;
  auVar153._4_4_ = uVar119;
  auVar153._0_4_ = uVar119;
  auVar153._8_4_ = uVar119;
  auVar153._12_4_ = uVar119;
  auVar59 = vshufps_avx(local_2e0,local_2e0,0x55);
  auVar68 = vshufps_avx(local_2e0,local_2e0,0xaa);
  auVar248._0_4_ = auVar68._0_4_ * fVar118;
  auVar248._4_4_ = auVar68._4_4_ * fVar124;
  auVar248._8_4_ = auVar68._8_4_ * fVar263;
  auVar248._12_4_ = auVar68._12_4_ * fVar247;
  auVar59 = vfmadd231ps_fma(auVar248,(undefined1  [16])aVar4,auVar59);
  auVar78 = vfmadd231ps_fma(auVar59,(undefined1  [16])aVar3,auVar153);
  local_2f0 = vsubps_avx512vl(_local_370,auVar58);
  uVar119 = local_2f0._0_4_;
  auVar154._4_4_ = uVar119;
  auVar154._0_4_ = uVar119;
  auVar154._8_4_ = uVar119;
  auVar154._12_4_ = uVar119;
  auVar59 = vshufps_avx(local_2f0,local_2f0,0x55);
  auVar68 = vshufps_avx(local_2f0,local_2f0,0xaa);
  auVar264._0_4_ = auVar68._0_4_ * fVar118;
  auVar264._4_4_ = auVar68._4_4_ * fVar124;
  auVar264._8_4_ = auVar68._8_4_ * fVar263;
  auVar264._12_4_ = auVar68._12_4_ * fVar247;
  auVar59 = vfmadd231ps_fma(auVar264,(undefined1  [16])aVar4,auVar59);
  auVar79 = vfmadd231ps_fma(auVar59,(undefined1  [16])aVar3,auVar154);
  local_300 = vsubps_avx512vl(_local_380,auVar58);
  uVar119 = local_300._0_4_;
  auVar155._4_4_ = uVar119;
  auVar155._0_4_ = uVar119;
  auVar155._8_4_ = uVar119;
  auVar155._12_4_ = uVar119;
  auVar59 = vshufps_avx(local_300,local_300,0x55);
  auVar68 = vshufps_avx(local_300,local_300,0xaa);
  auVar272._0_4_ = auVar68._0_4_ * fVar118;
  auVar272._4_4_ = auVar68._4_4_ * fVar124;
  auVar272._8_4_ = auVar68._8_4_ * fVar263;
  auVar272._12_4_ = auVar68._12_4_ * fVar247;
  auVar59 = vfmadd231ps_fma(auVar272,(undefined1  [16])aVar4,auVar59);
  auVar80 = vfmadd231ps_fma(auVar59,(undefined1  [16])aVar3,auVar155);
  local_310 = vsubps_avx(_local_390,auVar58);
  uVar119 = local_310._0_4_;
  auVar138._4_4_ = uVar119;
  auVar138._0_4_ = uVar119;
  auVar138._8_4_ = uVar119;
  auVar138._12_4_ = uVar119;
  auVar58 = vshufps_avx(local_310,local_310,0x55);
  auVar59 = vshufps_avx(local_310,local_310,0xaa);
  auVar201._0_4_ = fVar118 * auVar59._0_4_;
  auVar201._4_4_ = fVar124 * auVar59._4_4_;
  auVar201._8_4_ = fVar263 * auVar59._8_4_;
  auVar201._12_4_ = fVar247 * auVar59._12_4_;
  auVar58 = vfmadd231ps_fma(auVar201,(undefined1  [16])aVar4,auVar58);
  auVar23 = vfmadd231ps_fma(auVar58,(undefined1  [16])aVar3,auVar138);
  auVar68 = vmovlhps_avx(auVar73,auVar78);
  auVar67 = vmovlhps_avx(auVar75,auVar79);
  auVar74 = vmovlhps_avx(auVar76,auVar80);
  auVar72 = vmovlhps_avx512f(auVar77,auVar23);
  auVar59 = vminps_avx(auVar68,auVar67);
  auVar58 = vmaxps_avx(auVar68,auVar67);
  auVar71 = vminps_avx512vl(auVar74,auVar72);
  auVar59 = vminps_avx(auVar59,auVar71);
  auVar71 = vmaxps_avx512vl(auVar74,auVar72);
  auVar58 = vmaxps_avx(auVar58,auVar71);
  auVar71 = vshufpd_avx(auVar59,auVar59,3);
  auVar59 = vminps_avx(auVar59,auVar71);
  auVar71 = vshufpd_avx(auVar58,auVar58,3);
  auVar58 = vmaxps_avx(auVar58,auVar71);
  auVar59 = vandps_avx512vl(auVar59,auVar299._0_16_);
  auVar58 = vandps_avx512vl(auVar58,auVar299._0_16_);
  auVar58 = vmaxps_avx(auVar59,auVar58);
  auVar59 = vmovshdup_avx(auVar58);
  auVar58 = vmaxss_avx(auVar59,auVar58);
  fVar124 = auVar58._0_4_ * 9.536743e-07;
  auVar59 = vmovddup_avx512vl(auVar73);
  auVar71 = vmovddup_avx512vl(auVar75);
  auVar227._0_8_ = auVar76._0_8_;
  auVar227._8_8_ = auVar227._0_8_;
  auVar240._0_8_ = auVar77._0_8_;
  auVar240._8_8_ = auVar240._0_8_;
  local_1c0 = vbroadcastss_avx512vl(ZEXT416((uint)fVar124));
  auVar38._8_4_ = 0x80000000;
  auVar38._0_8_ = 0x8000000080000000;
  auVar38._12_4_ = 0x80000000;
  auVar58 = vxorps_avx512vl(local_1c0._0_16_,auVar38);
  local_1e0 = vbroadcastss_avx512vl(auVar58);
  bVar55 = false;
  uVar47 = 0;
  fVar118 = *(float *)(ray + k * 4 + 0x60);
  local_270 = vsubps_avx(auVar67,auVar68);
  local_280 = vsubps_avx(auVar74,auVar67);
  local_290 = vsubps_avx512vl(auVar72,auVar74);
  local_3b0 = vsubps_avx512vl(_local_360,local_320);
  local_3c0 = vsubps_avx512vl(_local_370,local_330);
  local_3d0 = vsubps_avx512vl(_local_380,local_340);
  _local_3e0 = vsubps_avx(_local_390,local_350);
  local_220 = vpbroadcastd_avx512vl();
  auVar58 = ZEXT816(0x3f80000000000000);
  auVar297 = ZEXT1664(auVar58);
  do {
    auVar301 = ZEXT3264(local_1e0);
    auVar63 = auVar297._0_16_;
    auVar73 = vshufps_avx(auVar63,auVar63,0x50);
    auVar281._8_4_ = 0x3f800000;
    auVar281._0_8_ = &DAT_3f8000003f800000;
    auVar281._12_4_ = 0x3f800000;
    auVar284._16_4_ = 0x3f800000;
    auVar284._0_16_ = auVar281;
    auVar284._20_4_ = 0x3f800000;
    auVar284._24_4_ = 0x3f800000;
    auVar284._28_4_ = 0x3f800000;
    auVar75 = vsubps_avx(auVar281,auVar73);
    fVar263 = auVar73._0_4_;
    fVar148 = auVar78._0_4_;
    auVar156._0_4_ = fVar148 * fVar263;
    fVar247 = auVar73._4_4_;
    fVar147 = auVar78._4_4_;
    auVar156._4_4_ = fVar147 * fVar247;
    fVar258 = auVar73._8_4_;
    auVar156._8_4_ = fVar148 * fVar258;
    fVar259 = auVar73._12_4_;
    auVar156._12_4_ = fVar147 * fVar259;
    fVar165 = auVar79._0_4_;
    auVar170._0_4_ = fVar165 * fVar263;
    fVar166 = auVar79._4_4_;
    auVar170._4_4_ = fVar166 * fVar247;
    auVar170._8_4_ = fVar165 * fVar258;
    auVar170._12_4_ = fVar166 * fVar259;
    fVar246 = auVar80._0_4_;
    auVar188._0_4_ = fVar246 * fVar263;
    fVar257 = auVar80._4_4_;
    auVar188._4_4_ = fVar257 * fVar247;
    auVar188._8_4_ = fVar246 * fVar258;
    auVar188._12_4_ = fVar257 * fVar259;
    fVar167 = auVar23._0_4_;
    auVar131._0_4_ = fVar167 * fVar263;
    fVar206 = auVar23._4_4_;
    auVar131._4_4_ = fVar206 * fVar247;
    auVar131._8_4_ = fVar167 * fVar258;
    auVar131._12_4_ = fVar206 * fVar259;
    auVar77 = vfmadd231ps_avx512vl(auVar156,auVar75,auVar59);
    auVar60 = vfmadd231ps_avx512vl(auVar170,auVar75,auVar71);
    auVar76 = vfmadd231ps_fma(auVar188,auVar75,auVar227);
    auVar75 = vfmadd231ps_fma(auVar131,auVar240,auVar75);
    auVar73 = vmovshdup_avx(auVar58);
    fVar247 = auVar58._0_4_;
    fVar263 = (auVar73._0_4_ - fVar247) * 0.04761905;
    auVar162._4_4_ = fVar247;
    auVar162._0_4_ = fVar247;
    auVar162._8_4_ = fVar247;
    auVar162._12_4_ = fVar247;
    auVar162._16_4_ = fVar247;
    auVar162._20_4_ = fVar247;
    auVar162._24_4_ = fVar247;
    auVar162._28_4_ = fVar247;
    auVar94._0_8_ = auVar73._0_8_;
    auVar94._8_8_ = auVar94._0_8_;
    auVar94._16_8_ = auVar94._0_8_;
    auVar94._24_8_ = auVar94._0_8_;
    auVar103 = vsubps_avx(auVar94,auVar162);
    uVar119 = auVar77._0_4_;
    auVar105._4_4_ = uVar119;
    auVar105._0_4_ = uVar119;
    auVar105._8_4_ = uVar119;
    auVar105._12_4_ = uVar119;
    auVar105._16_4_ = uVar119;
    auVar105._20_4_ = uVar119;
    auVar105._24_4_ = uVar119;
    auVar105._28_4_ = uVar119;
    auVar95._8_4_ = 1;
    auVar95._0_8_ = 0x100000001;
    auVar95._12_4_ = 1;
    auVar95._16_4_ = 1;
    auVar95._20_4_ = 1;
    auVar95._24_4_ = 1;
    auVar95._28_4_ = 1;
    auVar101 = ZEXT1632(auVar77);
    auVar99 = vpermps_avx2(auVar95,auVar101);
    auVar85 = vbroadcastss_avx512vl(auVar60);
    auVar102 = ZEXT1632(auVar60);
    auVar86 = vpermps_avx512vl(auVar95,auVar102);
    auVar87 = vbroadcastss_avx512vl(auVar76);
    auVar100 = ZEXT1632(auVar76);
    auVar88 = vpermps_avx512vl(auVar95,auVar100);
    auVar89 = vbroadcastss_avx512vl(auVar75);
    auVar98 = ZEXT1632(auVar75);
    auVar90 = vpermps_avx512vl(auVar95,auVar98);
    auVar244._4_4_ = fVar263;
    auVar244._0_4_ = fVar263;
    auVar244._8_4_ = fVar263;
    auVar244._12_4_ = fVar263;
    auVar244._16_4_ = fVar263;
    auVar244._20_4_ = fVar263;
    auVar244._24_4_ = fVar263;
    auVar244._28_4_ = fVar263;
    auVar96._8_4_ = 2;
    auVar96._0_8_ = 0x200000002;
    auVar96._12_4_ = 2;
    auVar96._16_4_ = 2;
    auVar96._20_4_ = 2;
    auVar96._24_4_ = 2;
    auVar96._28_4_ = 2;
    auVar91 = vpermps_avx512vl(auVar96,auVar101);
    auVar92 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar93 = vpermps_avx512vl(auVar92,auVar101);
    auVar101 = vpermps_avx2(auVar96,auVar102);
    auVar94 = vpermps_avx512vl(auVar92,auVar102);
    auVar102 = vpermps_avx2(auVar96,auVar100);
    auVar95 = vpermps_avx512vl(auVar92,auVar100);
    auVar96 = vpermps_avx512vl(auVar96,auVar98);
    auVar97 = vpermps_avx512vl(auVar92,auVar98);
    auVar73 = vfmadd132ps_fma(auVar103,auVar162,_DAT_02020f20);
    auVar103 = vsubps_avx(auVar284,ZEXT1632(auVar73));
    auVar92 = vmulps_avx512vl(auVar85,ZEXT1632(auVar73));
    auVar100 = ZEXT1632(auVar73);
    auVar98 = vmulps_avx512vl(auVar86,auVar100);
    auVar75 = vfmadd231ps_fma(auVar92,auVar103,auVar105);
    auVar76 = vfmadd231ps_fma(auVar98,auVar103,auVar99);
    auVar92 = vmulps_avx512vl(auVar87,auVar100);
    auVar98 = vmulps_avx512vl(auVar88,auVar100);
    auVar85 = vfmadd231ps_avx512vl(auVar92,auVar103,auVar85);
    auVar86 = vfmadd231ps_avx512vl(auVar98,auVar103,auVar86);
    auVar92 = vmulps_avx512vl(auVar89,auVar100);
    auVar105 = ZEXT1632(auVar73);
    auVar90 = vmulps_avx512vl(auVar90,auVar105);
    auVar87 = vfmadd231ps_avx512vl(auVar92,auVar103,auVar87);
    auVar88 = vfmadd231ps_avx512vl(auVar90,auVar103,auVar88);
    fVar258 = auVar73._0_4_;
    fVar259 = auVar73._4_4_;
    auVar90._4_4_ = fVar259 * auVar85._4_4_;
    auVar90._0_4_ = fVar258 * auVar85._0_4_;
    fVar260 = auVar73._8_4_;
    auVar90._8_4_ = fVar260 * auVar85._8_4_;
    fVar261 = auVar73._12_4_;
    auVar90._12_4_ = fVar261 * auVar85._12_4_;
    auVar90._16_4_ = auVar85._16_4_ * 0.0;
    auVar90._20_4_ = auVar85._20_4_ * 0.0;
    auVar90._24_4_ = auVar85._24_4_ * 0.0;
    auVar90._28_4_ = fVar247;
    auVar92._4_4_ = fVar259 * auVar86._4_4_;
    auVar92._0_4_ = fVar258 * auVar86._0_4_;
    auVar92._8_4_ = fVar260 * auVar86._8_4_;
    auVar92._12_4_ = fVar261 * auVar86._12_4_;
    auVar92._16_4_ = auVar86._16_4_ * 0.0;
    auVar92._20_4_ = auVar86._20_4_ * 0.0;
    auVar92._24_4_ = auVar86._24_4_ * 0.0;
    auVar92._28_4_ = auVar99._28_4_;
    auVar75 = vfmadd231ps_fma(auVar90,auVar103,ZEXT1632(auVar75));
    auVar76 = vfmadd231ps_fma(auVar92,auVar103,ZEXT1632(auVar76));
    auVar104._0_4_ = fVar258 * auVar87._0_4_;
    auVar104._4_4_ = fVar259 * auVar87._4_4_;
    auVar104._8_4_ = fVar260 * auVar87._8_4_;
    auVar104._12_4_ = fVar261 * auVar87._12_4_;
    auVar104._16_4_ = auVar87._16_4_ * 0.0;
    auVar104._20_4_ = auVar87._20_4_ * 0.0;
    auVar104._24_4_ = auVar87._24_4_ * 0.0;
    auVar104._28_4_ = 0;
    auVar98._4_4_ = fVar259 * auVar88._4_4_;
    auVar98._0_4_ = fVar258 * auVar88._0_4_;
    auVar98._8_4_ = fVar260 * auVar88._8_4_;
    auVar98._12_4_ = fVar261 * auVar88._12_4_;
    auVar98._16_4_ = auVar88._16_4_ * 0.0;
    auVar98._20_4_ = auVar88._20_4_ * 0.0;
    auVar98._24_4_ = auVar88._24_4_ * 0.0;
    auVar98._28_4_ = auVar87._28_4_;
    auVar77 = vfmadd231ps_fma(auVar104,auVar103,auVar85);
    auVar60 = vfmadd231ps_fma(auVar98,auVar103,auVar86);
    auVar100._28_4_ = auVar86._28_4_;
    auVar100._0_28_ =
         ZEXT1628(CONCAT412(fVar261 * auVar60._12_4_,
                            CONCAT48(fVar260 * auVar60._8_4_,
                                     CONCAT44(fVar259 * auVar60._4_4_,fVar258 * auVar60._0_4_))));
    auVar61 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar261 * auVar77._12_4_,
                                                 CONCAT48(fVar260 * auVar77._8_4_,
                                                          CONCAT44(fVar259 * auVar77._4_4_,
                                                                   fVar258 * auVar77._0_4_)))),
                              auVar103,ZEXT1632(auVar75));
    auVar62 = vfmadd231ps_fma(auVar100,auVar103,ZEXT1632(auVar76));
    auVar99 = vsubps_avx(ZEXT1632(auVar77),ZEXT1632(auVar75));
    auVar85 = vsubps_avx(ZEXT1632(auVar60),ZEXT1632(auVar76));
    auVar86 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar99 = vmulps_avx512vl(auVar99,auVar86);
    auVar85 = vmulps_avx512vl(auVar85,auVar86);
    auVar174._0_4_ = fVar263 * auVar99._0_4_;
    auVar174._4_4_ = fVar263 * auVar99._4_4_;
    auVar174._8_4_ = fVar263 * auVar99._8_4_;
    auVar174._12_4_ = fVar263 * auVar99._12_4_;
    auVar174._16_4_ = fVar263 * auVar99._16_4_;
    auVar174._20_4_ = fVar263 * auVar99._20_4_;
    auVar174._24_4_ = fVar263 * auVar99._24_4_;
    auVar174._28_4_ = 0;
    auVar99 = vmulps_avx512vl(auVar244,auVar85);
    auVar77 = vxorps_avx512vl(auVar89._0_16_,auVar89._0_16_);
    auVar85 = vpermt2ps_avx512vl(ZEXT1632(auVar61),_DAT_0205fd20,ZEXT1632(auVar77));
    auVar87 = vpermt2ps_avx512vl(ZEXT1632(auVar62),_DAT_0205fd20,ZEXT1632(auVar77));
    auVar137._0_4_ = auVar174._0_4_ + auVar61._0_4_;
    auVar137._4_4_ = auVar174._4_4_ + auVar61._4_4_;
    auVar137._8_4_ = auVar174._8_4_ + auVar61._8_4_;
    auVar137._12_4_ = auVar174._12_4_ + auVar61._12_4_;
    auVar137._16_4_ = auVar174._16_4_ + 0.0;
    auVar137._20_4_ = auVar174._20_4_ + 0.0;
    auVar137._24_4_ = auVar174._24_4_ + 0.0;
    auVar137._28_4_ = 0;
    auVar104 = ZEXT1632(auVar77);
    auVar88 = vpermt2ps_avx512vl(auVar174,_DAT_0205fd20,auVar104);
    auVar90 = vaddps_avx512vl(ZEXT1632(auVar62),auVar99);
    auVar92 = vpermt2ps_avx512vl(auVar99,_DAT_0205fd20,auVar104);
    auVar99 = vsubps_avx(auVar85,auVar88);
    auVar88 = vsubps_avx512vl(auVar87,auVar92);
    auVar92 = vmulps_avx512vl(auVar101,auVar105);
    auVar98 = vmulps_avx512vl(auVar94,auVar105);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar103,auVar91);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar103,auVar93);
    auVar100 = vmulps_avx512vl(auVar102,auVar105);
    auVar89 = vmulps_avx512vl(auVar95,auVar105);
    auVar101 = vfmadd231ps_avx512vl(auVar100,auVar103,auVar101);
    auVar100 = vfmadd231ps_avx512vl(auVar89,auVar103,auVar94);
    auVar89 = vmulps_avx512vl(auVar96,auVar105);
    auVar91 = vmulps_avx512vl(auVar97,auVar105);
    auVar75 = vfmadd231ps_fma(auVar89,auVar103,auVar102);
    auVar76 = vfmadd231ps_fma(auVar91,auVar103,auVar95);
    auVar89 = vmulps_avx512vl(auVar105,auVar101);
    auVar91 = vmulps_avx512vl(ZEXT1632(auVar73),auVar100);
    auVar92 = vfmadd231ps_avx512vl(auVar89,auVar103,auVar92);
    auVar98 = vfmadd231ps_avx512vl(auVar91,auVar103,auVar98);
    auVar101 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(fVar261 * auVar75._12_4_,
                                             CONCAT48(fVar260 * auVar75._8_4_,
                                                      CONCAT44(fVar259 * auVar75._4_4_,
                                                               fVar258 * auVar75._0_4_)))),auVar103,
                          auVar101);
    auVar100 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(fVar261 * auVar76._12_4_,
                                             CONCAT48(fVar260 * auVar76._8_4_,
                                                      CONCAT44(fVar259 * auVar76._4_4_,
                                                               fVar258 * auVar76._0_4_)))),auVar103,
                          auVar100);
    auVar89._4_4_ = fVar259 * auVar101._4_4_;
    auVar89._0_4_ = fVar258 * auVar101._0_4_;
    auVar89._8_4_ = fVar260 * auVar101._8_4_;
    auVar89._12_4_ = fVar261 * auVar101._12_4_;
    auVar89._16_4_ = auVar101._16_4_ * 0.0;
    auVar89._20_4_ = auVar101._20_4_ * 0.0;
    auVar89._24_4_ = auVar101._24_4_ * 0.0;
    auVar89._28_4_ = auVar95._28_4_;
    auVar91._4_4_ = fVar259 * auVar100._4_4_;
    auVar91._0_4_ = fVar258 * auVar100._0_4_;
    auVar91._8_4_ = fVar260 * auVar100._8_4_;
    auVar91._12_4_ = fVar261 * auVar100._12_4_;
    auVar91._16_4_ = auVar100._16_4_ * 0.0;
    auVar91._20_4_ = auVar100._20_4_ * 0.0;
    auVar91._24_4_ = auVar100._24_4_ * 0.0;
    auVar91._28_4_ = auVar102._28_4_;
    auVar102 = vfmadd231ps_avx512vl(auVar89,auVar103,auVar92);
    auVar89 = vfmadd231ps_avx512vl(auVar91,auVar98,auVar103);
    auVar103 = vsubps_avx512vl(auVar101,auVar92);
    auVar101 = vsubps_avx512vl(auVar100,auVar98);
    auVar103 = vmulps_avx512vl(auVar103,auVar86);
    auVar101 = vmulps_avx512vl(auVar101,auVar86);
    fVar247 = fVar263 * auVar103._0_4_;
    fVar258 = fVar263 * auVar103._4_4_;
    auVar93._4_4_ = fVar258;
    auVar93._0_4_ = fVar247;
    fVar259 = fVar263 * auVar103._8_4_;
    auVar93._8_4_ = fVar259;
    fVar260 = fVar263 * auVar103._12_4_;
    auVar93._12_4_ = fVar260;
    fVar261 = fVar263 * auVar103._16_4_;
    auVar93._16_4_ = fVar261;
    fVar262 = fVar263 * auVar103._20_4_;
    auVar93._20_4_ = fVar262;
    fVar263 = fVar263 * auVar103._24_4_;
    auVar93._24_4_ = fVar263;
    auVar93._28_4_ = auVar103._28_4_;
    auVar101 = vmulps_avx512vl(auVar244,auVar101);
    auVar86 = vpermt2ps_avx512vl(auVar102,_DAT_0205fd20,auVar104);
    auVar92 = vpermt2ps_avx512vl(auVar89,_DAT_0205fd20,auVar104);
    auVar245._0_4_ = auVar102._0_4_ + fVar247;
    auVar245._4_4_ = auVar102._4_4_ + fVar258;
    auVar245._8_4_ = auVar102._8_4_ + fVar259;
    auVar245._12_4_ = auVar102._12_4_ + fVar260;
    auVar245._16_4_ = auVar102._16_4_ + fVar261;
    auVar245._20_4_ = auVar102._20_4_ + fVar262;
    auVar245._24_4_ = auVar102._24_4_ + fVar263;
    auVar245._28_4_ = auVar102._28_4_ + auVar103._28_4_;
    auVar103 = vpermt2ps_avx512vl(auVar93,_DAT_0205fd20,ZEXT1632(auVar77));
    auVar98 = vaddps_avx512vl(auVar89,auVar101);
    auVar101 = vpermt2ps_avx512vl(auVar101,_DAT_0205fd20,ZEXT1632(auVar77));
    auVar103 = vsubps_avx(auVar86,auVar103);
    auVar101 = vsubps_avx512vl(auVar92,auVar101);
    auVar162 = ZEXT1632(auVar61);
    auVar100 = vsubps_avx512vl(auVar102,auVar162);
    auVar174 = ZEXT1632(auVar62);
    auVar91 = vsubps_avx512vl(auVar89,auVar174);
    auVar93 = vsubps_avx512vl(auVar86,auVar85);
    auVar100 = vaddps_avx512vl(auVar100,auVar93);
    auVar93 = vsubps_avx512vl(auVar92,auVar87);
    auVar91 = vaddps_avx512vl(auVar91,auVar93);
    auVar93 = vmulps_avx512vl(auVar174,auVar100);
    auVar93 = vfnmadd231ps_avx512vl(auVar93,auVar162,auVar91);
    auVar94 = vmulps_avx512vl(auVar90,auVar100);
    auVar94 = vfnmadd231ps_avx512vl(auVar94,auVar137,auVar91);
    auVar95 = vmulps_avx512vl(auVar88,auVar100);
    auVar95 = vfnmadd231ps_avx512vl(auVar95,auVar99,auVar91);
    auVar96 = vmulps_avx512vl(auVar87,auVar100);
    auVar96 = vfnmadd231ps_avx512vl(auVar96,auVar85,auVar91);
    auVar97 = vmulps_avx512vl(auVar89,auVar100);
    auVar97 = vfnmadd231ps_avx512vl(auVar97,auVar102,auVar91);
    auVar104 = vmulps_avx512vl(auVar98,auVar100);
    auVar104 = vfnmadd231ps_avx512vl(auVar104,auVar245,auVar91);
    auVar105 = vmulps_avx512vl(auVar101,auVar100);
    auVar105 = vfnmadd231ps_avx512vl(auVar105,auVar103,auVar91);
    auVar100 = vmulps_avx512vl(auVar92,auVar100);
    auVar100 = vfnmadd231ps_avx512vl(auVar100,auVar86,auVar91);
    auVar91 = vminps_avx512vl(auVar93,auVar94);
    auVar93 = vmaxps_avx512vl(auVar93,auVar94);
    auVar94 = vminps_avx512vl(auVar95,auVar96);
    auVar91 = vminps_avx512vl(auVar91,auVar94);
    auVar94 = vmaxps_avx512vl(auVar95,auVar96);
    auVar93 = vmaxps_avx512vl(auVar93,auVar94);
    auVar94 = vminps_avx512vl(auVar97,auVar104);
    auVar95 = vmaxps_avx512vl(auVar97,auVar104);
    auVar96 = vminps_avx512vl(auVar105,auVar100);
    auVar94 = vminps_avx512vl(auVar94,auVar96);
    auVar91 = vminps_avx512vl(auVar91,auVar94);
    auVar100 = vmaxps_avx512vl(auVar105,auVar100);
    auVar100 = vmaxps_avx512vl(auVar95,auVar100);
    auVar100 = vmaxps_avx512vl(auVar93,auVar100);
    uVar20 = vcmpps_avx512vl(auVar91,local_1c0,2);
    uVar21 = vcmpps_avx512vl(auVar100,local_1e0,5);
    uVar52 = 0;
    bVar45 = (byte)uVar20 & (byte)uVar21 & 0x7f;
    if (bVar45 != 0) {
      auVar100 = vsubps_avx512vl(auVar85,auVar162);
      auVar91 = vsubps_avx512vl(auVar87,auVar174);
      auVar93 = vsubps_avx512vl(auVar86,auVar102);
      auVar100 = vaddps_avx512vl(auVar100,auVar93);
      auVar93 = vsubps_avx512vl(auVar92,auVar89);
      auVar91 = vaddps_avx512vl(auVar91,auVar93);
      auVar93 = vmulps_avx512vl(auVar174,auVar100);
      auVar93 = vfnmadd231ps_avx512vl(auVar93,auVar91,auVar162);
      auVar90 = vmulps_avx512vl(auVar90,auVar100);
      auVar90 = vfnmadd213ps_avx512vl(auVar137,auVar91,auVar90);
      auVar88 = vmulps_avx512vl(auVar88,auVar100);
      auVar88 = vfnmadd213ps_avx512vl(auVar99,auVar91,auVar88);
      auVar99 = vmulps_avx512vl(auVar87,auVar100);
      auVar87 = vfnmadd231ps_avx512vl(auVar99,auVar91,auVar85);
      auVar99 = vmulps_avx512vl(auVar89,auVar100);
      auVar102 = vfnmadd231ps_avx512vl(auVar99,auVar91,auVar102);
      auVar99 = vmulps_avx512vl(auVar98,auVar100);
      auVar98 = vfnmadd213ps_avx512vl(auVar245,auVar91,auVar99);
      auVar99 = vmulps_avx512vl(auVar101,auVar100);
      auVar89 = vfnmadd213ps_avx512vl(auVar103,auVar91,auVar99);
      auVar103 = vmulps_avx512vl(auVar92,auVar100);
      auVar86 = vfnmadd231ps_avx512vl(auVar103,auVar86,auVar91);
      auVar99 = vminps_avx(auVar93,auVar90);
      auVar103 = vmaxps_avx(auVar93,auVar90);
      auVar85 = vminps_avx(auVar88,auVar87);
      auVar85 = vminps_avx(auVar99,auVar85);
      auVar99 = vmaxps_avx(auVar88,auVar87);
      auVar103 = vmaxps_avx(auVar103,auVar99);
      auVar101 = vminps_avx(auVar102,auVar98);
      auVar99 = vmaxps_avx(auVar102,auVar98);
      auVar102 = vminps_avx(auVar89,auVar86);
      auVar101 = vminps_avx(auVar101,auVar102);
      auVar101 = vminps_avx(auVar85,auVar101);
      auVar85 = vmaxps_avx(auVar89,auVar86);
      auVar99 = vmaxps_avx(auVar99,auVar85);
      auVar103 = vmaxps_avx(auVar103,auVar99);
      uVar20 = vcmpps_avx512vl(auVar103,local_1e0,5);
      uVar21 = vcmpps_avx512vl(auVar101,local_1c0,2);
      uVar52 = (uint)(bVar45 & (byte)uVar20 & (byte)uVar21);
    }
    if (uVar52 != 0) {
      auStack_440[uVar47] = uVar52;
      uVar20 = vmovlps_avx(auVar58);
      *(undefined8 *)(&uStack_260 + uVar47 * 2) = uVar20;
      uVar50 = vmovlps_avx(auVar63);
      auStack_1a0[uVar47] = uVar50;
      uVar47 = (ulong)((int)uVar47 + 1);
    }
    auVar103 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar298 = ZEXT3264(auVar103);
    do {
      in_ZMM24 = ZEXT464(0xb8d1b717);
      auVar75 = auVar304._0_16_;
      auVar58 = in_ZMM24._0_16_;
      auVar73 = SUB6416(ZEXT464(0x38d1b717),0);
      if ((int)uVar47 == 0) {
        if (bVar55) {
          return local_5a1;
        }
        uVar119 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar42._4_4_ = uVar119;
        auVar42._0_4_ = uVar119;
        auVar42._8_4_ = uVar119;
        auVar42._12_4_ = uVar119;
        uVar20 = vcmpps_avx512vl(local_3a0,auVar42,2);
        uVar54 = (uint)uVar57 & (uint)uVar57 + 0xf & (uint)uVar20;
        uVar57 = (ulong)uVar54;
        local_5a1 = uVar54 != 0;
        if (!local_5a1) {
          return local_5a1;
        }
        goto LAB_01c607f7;
      }
      uVar46 = (int)uVar47 - 1;
      uVar48 = (ulong)uVar46;
      uVar52 = (&uStack_260)[uVar48 * 2];
      fVar263 = afStack_25c[uVar48 * 2];
      uVar6 = auStack_440[uVar48];
      auVar296._8_8_ = 0;
      auVar296._0_8_ = auStack_1a0[uVar48];
      auVar297 = ZEXT1664(auVar296);
      lVar51 = 0;
      for (uVar50 = (ulong)uVar6; (uVar50 & 1) == 0; uVar50 = uVar50 >> 1 | 0x8000000000000000) {
        lVar51 = lVar51 + 1;
      }
      uVar49 = uVar6 - 1 & uVar6;
      auStack_440[uVar48] = uVar49;
      if (uVar49 == 0) {
        uVar47 = (ulong)uVar46;
      }
      auVar77 = vpxord_avx512vl(auVar301._0_16_,auVar301._0_16_);
      auVar76 = vcvtsi2ss_avx512f(auVar77,lVar51);
      auVar60 = vmulss_avx512f(auVar76,SUB6416(ZEXT464(0x3e124925),0));
      lVar51 = lVar51 + 1;
      auVar76 = vpxord_avx512vl(auVar77,auVar77);
      auVar76 = vcvtsi2ss_avx512f(auVar76,lVar51);
      auVar76 = vmulss_avx512f(auVar76,SUB6416(ZEXT464(0x3e124925),0));
      auVar61 = auVar300._0_16_;
      auVar77 = vsubss_avx512f(auVar61,auVar60);
      auVar60 = vmulss_avx512f(ZEXT416((uint)fVar263),auVar60);
      auVar77 = vfmadd231ss_avx512f(auVar60,ZEXT416(uVar52),auVar77);
      auVar60 = vsubss_avx512f(auVar61,auVar76);
      auVar76 = vfmadd231ss_fma(ZEXT416((uint)(fVar263 * auVar76._0_4_)),ZEXT416(uVar52),auVar60);
      auVar60 = vsubss_avx512f(auVar76,auVar77);
      vucomiss_avx512f(auVar60);
      if (uVar6 == 0 || lVar51 == 0) break;
      auVar301 = ZEXT1664(auVar296);
      auVar62 = vshufps_avx(auVar296,auVar296,0x50);
      vucomiss_avx512f(auVar60);
      uVar52 = (uint)uVar47;
      auVar139._8_4_ = 0x3f800000;
      auVar139._0_8_ = &DAT_3f8000003f800000;
      auVar139._12_4_ = 0x3f800000;
      auVar63 = vsubps_avx(auVar139,auVar62);
      fVar263 = auVar62._0_4_;
      auVar157._0_4_ = fVar263 * fVar148;
      fVar247 = auVar62._4_4_;
      auVar157._4_4_ = fVar247 * fVar147;
      fVar258 = auVar62._8_4_;
      auVar157._8_4_ = fVar258 * fVar148;
      fVar259 = auVar62._12_4_;
      auVar157._12_4_ = fVar259 * fVar147;
      auVar171._0_4_ = fVar263 * fVar165;
      auVar171._4_4_ = fVar247 * fVar166;
      auVar171._8_4_ = fVar258 * fVar165;
      auVar171._12_4_ = fVar259 * fVar166;
      auVar189._0_4_ = fVar263 * fVar246;
      auVar189._4_4_ = fVar247 * fVar257;
      auVar189._8_4_ = fVar258 * fVar246;
      auVar189._12_4_ = fVar259 * fVar257;
      auVar132._0_4_ = fVar263 * fVar167;
      auVar132._4_4_ = fVar247 * fVar206;
      auVar132._8_4_ = fVar258 * fVar167;
      auVar132._12_4_ = fVar259 * fVar206;
      auVar62 = vfmadd231ps_fma(auVar157,auVar63,auVar59);
      auVar64 = vfmadd231ps_fma(auVar171,auVar63,auVar71);
      auVar65 = vfmadd231ps_fma(auVar189,auVar63,auVar227);
      auVar63 = vfmadd231ps_fma(auVar132,auVar63,auVar240);
      auVar146._16_16_ = auVar62;
      auVar146._0_16_ = auVar62;
      auVar163._16_16_ = auVar64;
      auVar163._0_16_ = auVar64;
      auVar175._16_16_ = auVar65;
      auVar175._0_16_ = auVar65;
      auVar62 = vbroadcastss_avx512vl(auVar77);
      uVar119 = auVar76._0_4_;
      auVar205._20_4_ = uVar119;
      auVar205._16_4_ = uVar119;
      auVar205._24_4_ = uVar119;
      auVar205._28_4_ = uVar119;
      auVar205._0_16_ = auVar62;
      auVar103 = vsubps_avx(auVar163,auVar146);
      auVar64 = vfmadd213ps_fma(auVar103,auVar205,auVar146);
      auVar103 = vsubps_avx(auVar175,auVar163);
      auVar66 = vfmadd213ps_fma(auVar103,auVar205,auVar163);
      auVar62 = vsubps_avx(auVar63,auVar65);
      auVar164._16_16_ = auVar62;
      auVar164._0_16_ = auVar62;
      auVar62 = vfmadd213ps_fma(auVar164,auVar205,auVar175);
      auVar103 = vsubps_avx(ZEXT1632(auVar66),ZEXT1632(auVar64));
      auVar63 = vfmadd213ps_fma(auVar103,auVar205,ZEXT1632(auVar64));
      auVar103 = vsubps_avx(ZEXT1632(auVar62),ZEXT1632(auVar66));
      auVar62 = vfmadd213ps_fma(auVar103,auVar205,ZEXT1632(auVar66));
      auVar103 = vsubps_avx(ZEXT1632(auVar62),ZEXT1632(auVar63));
      auVar177 = vfmadd231ps_fma(ZEXT1632(auVar63),auVar103,auVar205);
      auVar103 = vmulps_avx512vl(auVar103,auVar298._0_32_);
      auVar97._16_16_ = auVar103._16_16_;
      auVar62 = vmulss_avx512f(auVar60,SUB6416(ZEXT464(0x3eaaaaab),0));
      fVar263 = auVar62._0_4_;
      auVar190._0_8_ =
           CONCAT44(auVar177._4_4_ + fVar263 * auVar103._4_4_,
                    auVar177._0_4_ + fVar263 * auVar103._0_4_);
      auVar190._8_4_ = auVar177._8_4_ + fVar263 * auVar103._8_4_;
      auVar190._12_4_ = auVar177._12_4_ + fVar263 * auVar103._12_4_;
      auVar158._0_4_ = fVar263 * auVar103._16_4_;
      auVar158._4_4_ = fVar263 * auVar103._20_4_;
      auVar158._8_4_ = fVar263 * auVar103._24_4_;
      auVar158._12_4_ = fVar263 * auVar103._28_4_;
      auVar168 = vsubps_avx((undefined1  [16])0x0,auVar158);
      auVar70 = vshufpd_avx(auVar177,auVar177,3);
      auVar83 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar62 = vsubps_avx(auVar70,auVar177);
      auVar63 = vsubps_avx(auVar83,(undefined1  [16])0x0);
      auVar210._0_4_ = auVar63._0_4_ + auVar62._0_4_;
      auVar210._4_4_ = auVar63._4_4_ + auVar62._4_4_;
      auVar210._8_4_ = auVar63._8_4_ + auVar62._8_4_;
      auVar210._12_4_ = auVar63._12_4_ + auVar62._12_4_;
      auVar62 = vshufps_avx(auVar177,auVar177,0xb1);
      auVar63 = vshufps_avx(auVar190,auVar190,0xb1);
      auVar64 = vshufps_avx(auVar168,auVar168,0xb1);
      auVar65 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar273._4_4_ = auVar210._0_4_;
      auVar273._0_4_ = auVar210._0_4_;
      auVar273._8_4_ = auVar210._0_4_;
      auVar273._12_4_ = auVar210._0_4_;
      auVar66 = vshufps_avx(auVar210,auVar210,0x55);
      fVar263 = auVar66._0_4_;
      auVar228._0_4_ = auVar62._0_4_ * fVar263;
      fVar247 = auVar66._4_4_;
      auVar228._4_4_ = auVar62._4_4_ * fVar247;
      fVar258 = auVar66._8_4_;
      auVar228._8_4_ = auVar62._8_4_ * fVar258;
      fVar259 = auVar66._12_4_;
      auVar228._12_4_ = auVar62._12_4_ * fVar259;
      auVar241._0_4_ = auVar63._0_4_ * fVar263;
      auVar241._4_4_ = auVar63._4_4_ * fVar247;
      auVar241._8_4_ = auVar63._8_4_ * fVar258;
      auVar241._12_4_ = auVar63._12_4_ * fVar259;
      auVar249._0_4_ = auVar64._0_4_ * fVar263;
      auVar249._4_4_ = auVar64._4_4_ * fVar247;
      auVar249._8_4_ = auVar64._8_4_ * fVar258;
      auVar249._12_4_ = auVar64._12_4_ * fVar259;
      auVar211._0_4_ = auVar65._0_4_ * fVar263;
      auVar211._4_4_ = auVar65._4_4_ * fVar247;
      auVar211._8_4_ = auVar65._8_4_ * fVar258;
      auVar211._12_4_ = auVar65._12_4_ * fVar259;
      auVar62 = vfmadd231ps_fma(auVar228,auVar273,auVar177);
      auVar63 = vfmadd231ps_fma(auVar241,auVar273,auVar190);
      auVar66 = vfmadd231ps_fma(auVar249,auVar273,auVar168);
      auVar84 = vfmadd231ps_fma(auVar211,(undefined1  [16])0x0,auVar273);
      auVar69 = vshufpd_avx(auVar62,auVar62,1);
      auVar81 = vshufpd_avx(auVar63,auVar63,1);
      auVar82 = vshufpd_avx(auVar66,auVar66,1);
      auVar149 = vshufpd_avx(auVar84,auVar84,1);
      auVar64 = vminss_avx(auVar62,auVar63);
      auVar62 = vmaxss_avx(auVar63,auVar62);
      auVar65 = vminss_avx(auVar66,auVar84);
      auVar63 = vmaxss_avx(auVar84,auVar66);
      auVar65 = vminss_avx(auVar64,auVar65);
      auVar62 = vmaxss_avx(auVar63,auVar62);
      auVar66 = vminss_avx(auVar69,auVar81);
      auVar63 = vmaxss_avx(auVar81,auVar69);
      auVar69 = vminss_avx(auVar82,auVar149);
      auVar64 = vmaxss_avx(auVar149,auVar82);
      auVar66 = vminss_avx(auVar66,auVar69);
      auVar63 = vmaxss_avx(auVar64,auVar63);
      vucomiss_avx512f(auVar65);
      if ((uVar52 < 5) || (auVar63 = vucomiss_avx512f(auVar58), uVar52 < 5)) {
        auVar62 = vucomiss_avx512f(auVar58);
        uVar20 = vcmpps_avx512vl(auVar66,auVar73,1);
        uVar21 = vcmpps_avx512vl(auVar65,auVar73,1);
        if ((4 < uVar52 & ((byte)uVar21 | (byte)uVar20)) != 0) goto LAB_01c61b28;
        uVar20 = vcmpps_avx512vl(auVar58,auVar63,5);
        uVar21 = vcmpps_avx512vl(auVar66,auVar73,5);
        if ((((ushort)uVar21 | (ushort)uVar20) & 1) == 0) goto LAB_01c61b28;
        bVar22 = true;
        auVar297 = ZEXT1664(auVar296);
      }
      else {
LAB_01c61b28:
        uVar20 = vcmpss_avx512f(auVar65,auVar75,1);
        bVar22 = (bool)((byte)uVar20 & 1);
        iVar117 = auVar300._0_4_;
        fVar263 = (float)((uint)bVar22 * -0x40800000 + (uint)!bVar22 * iVar117);
        uVar20 = vcmpss_avx512f(auVar62,auVar75,1);
        bVar22 = (bool)((byte)uVar20 & 1);
        fVar247 = (float)((uint)bVar22 * -0x40800000 + (uint)!bVar22 * iVar117);
        bVar22 = fVar263 != fVar247;
        iVar303 = auVar304._0_4_;
        auVar97._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar106._4_28_ = auVar97._4_28_;
        auVar106._0_4_ = (uint)bVar22 * iVar303 + (uint)!bVar22 * 0x7f800000;
        auVar73 = auVar106._0_16_;
        auVar108._16_16_ = auVar97._16_16_;
        auVar108._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar107._4_28_ = auVar108._4_28_;
        auVar107._0_4_ = (uint)bVar22 * iVar303 + (uint)!bVar22 * -0x800000;
        auVar58 = auVar107._0_16_;
        uVar20 = vcmpss_avx512f(auVar66,auVar75,1);
        bVar22 = (bool)((byte)uVar20 & 1);
        fVar258 = (float)((uint)bVar22 * -0x40800000 + (uint)!bVar22 * iVar117);
        if ((fVar263 != fVar258) || (NAN(fVar263) || NAN(fVar258))) {
          fVar259 = auVar66._0_4_;
          fVar263 = auVar65._0_4_;
          bVar22 = fVar259 == fVar263;
          if ((!bVar22) || (NAN(fVar259) || NAN(fVar263))) {
            auVar41._8_4_ = 0x80000000;
            auVar41._0_8_ = 0x8000000080000000;
            auVar41._12_4_ = 0x80000000;
            auVar64 = vxorps_avx512vl(auVar65,auVar41);
            auVar288._0_4_ = auVar64._0_4_ / (fVar259 - fVar263);
            auVar288._4_12_ = auVar64._4_12_;
            auVar64 = vsubss_avx512f(auVar61,auVar288);
            auVar65 = vfmadd213ss_avx512f(auVar64,auVar75,auVar288);
            auVar64 = auVar65;
          }
          else {
            vucomiss_avx512f(auVar75);
            auVar110._16_16_ = auVar97._16_16_;
            auVar110._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar109._4_28_ = auVar110._4_28_;
            auVar109._0_4_ = (uint)bVar22 * iVar303 + (uint)!bVar22 * 0x7f800000;
            auVar65 = auVar109._0_16_;
            auVar64 = ZEXT416((uint)bVar22 * 0x3f800000 + (uint)!bVar22 * -0x800000);
          }
          auVar73 = vminss_avx(auVar73,auVar65);
          auVar58 = vmaxss_avx(auVar64,auVar58);
        }
        auVar297 = ZEXT1664(auVar296);
        uVar20 = vcmpss_avx512f(auVar63,auVar75,1);
        bVar22 = (bool)((byte)uVar20 & 1);
        fVar263 = (float)((uint)bVar22 * -0x40800000 + (uint)!bVar22 * iVar117);
        if ((fVar247 != fVar263) || (NAN(fVar247) || NAN(fVar263))) {
          fVar259 = auVar63._0_4_;
          fVar247 = auVar62._0_4_;
          bVar22 = fVar259 == fVar247;
          if ((!bVar22) || (NAN(fVar259) || NAN(fVar247))) {
            auVar40._8_4_ = 0x80000000;
            auVar40._0_8_ = 0x8000000080000000;
            auVar40._12_4_ = 0x80000000;
            auVar62 = vxorps_avx512vl(auVar62,auVar40);
            auVar250._0_4_ = auVar62._0_4_ / (fVar259 - fVar247);
            auVar250._4_12_ = auVar62._4_12_;
            auVar62 = vsubss_avx512f(auVar61,auVar250);
            auVar63 = vfmadd213ss_avx512f(auVar62,auVar75,auVar250);
            auVar62 = auVar63;
          }
          else {
            vucomiss_avx512f(auVar75);
            auVar112._16_16_ = auVar97._16_16_;
            auVar112._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar111._4_28_ = auVar112._4_28_;
            auVar111._0_4_ = (uint)bVar22 * iVar303 + (uint)!bVar22 * 0x7f800000;
            auVar63 = auVar111._0_16_;
            auVar62 = ZEXT416((uint)bVar22 * 0x3f800000 + (uint)!bVar22 * -0x800000);
          }
          auVar73 = vminss_avx(auVar73,auVar63);
          auVar58 = vmaxss_avx(auVar62,auVar58);
        }
        bVar22 = fVar258 != fVar263;
        auVar62 = vminss_avx512f(auVar73,auVar61);
        auVar114._16_16_ = auVar97._16_16_;
        auVar114._0_16_ = auVar73;
        auVar113._4_28_ = auVar114._4_28_;
        auVar113._0_4_ = (uint)bVar22 * auVar62._0_4_ + (uint)!bVar22 * auVar73._0_4_;
        auVar73 = vmaxss_avx512f(auVar61,auVar58);
        auVar116._16_16_ = auVar97._16_16_;
        auVar116._0_16_ = auVar58;
        auVar115._4_28_ = auVar116._4_28_;
        auVar115._0_4_ = (uint)bVar22 * auVar73._0_4_ + (uint)!bVar22 * auVar58._0_4_;
        auVar58 = vmaxss_avx512f(auVar75,auVar113._0_16_);
        auVar73 = vminss_avx512f(auVar115._0_16_,auVar61);
        bVar22 = true;
        if (auVar58._0_4_ <= auVar73._0_4_) {
          auVar81 = vmaxss_avx512f(auVar75,ZEXT416((uint)(auVar58._0_4_ + -0.1)));
          auVar82 = vminss_avx512f(ZEXT416((uint)(auVar73._0_4_ + 0.1)),auVar61);
          auVar133._0_8_ = auVar177._0_8_;
          auVar133._8_8_ = auVar133._0_8_;
          auVar242._8_8_ = auVar190._0_8_;
          auVar242._0_8_ = auVar190._0_8_;
          auVar251._8_8_ = auVar168._0_8_;
          auVar251._0_8_ = auVar168._0_8_;
          auVar58 = vshufpd_avx(auVar190,auVar190,3);
          auVar73 = vshufpd_avx(auVar168,auVar168,3);
          auVar62 = vshufps_avx(auVar81,auVar82,0);
          auVar274._8_4_ = 0x3f800000;
          auVar274._0_8_ = &DAT_3f8000003f800000;
          auVar274._12_4_ = 0x3f800000;
          auVar63 = vsubps_avx(auVar274,auVar62);
          fVar263 = auVar62._0_4_;
          auVar282._0_4_ = fVar263 * auVar70._0_4_;
          fVar247 = auVar62._4_4_;
          auVar282._4_4_ = fVar247 * auVar70._4_4_;
          fVar258 = auVar62._8_4_;
          auVar282._8_4_ = fVar258 * auVar70._8_4_;
          fVar259 = auVar62._12_4_;
          auVar282._12_4_ = fVar259 * auVar70._12_4_;
          auVar191._0_4_ = fVar263 * auVar58._0_4_;
          auVar191._4_4_ = fVar247 * auVar58._4_4_;
          auVar191._8_4_ = fVar258 * auVar58._8_4_;
          auVar191._12_4_ = fVar259 * auVar58._12_4_;
          auVar202._0_4_ = fVar263 * auVar73._0_4_;
          auVar202._4_4_ = fVar247 * auVar73._4_4_;
          auVar202._8_4_ = fVar258 * auVar73._8_4_;
          auVar202._12_4_ = fVar259 * auVar73._12_4_;
          auVar159._0_4_ = fVar263 * auVar83._0_4_;
          auVar159._4_4_ = fVar247 * auVar83._4_4_;
          auVar159._8_4_ = fVar258 * auVar83._8_4_;
          auVar159._12_4_ = fVar259 * auVar83._12_4_;
          auVar64 = vfmadd231ps_fma(auVar282,auVar63,auVar133);
          auVar65 = vfmadd231ps_fma(auVar191,auVar63,auVar242);
          auVar66 = vfmadd231ps_fma(auVar202,auVar63,auVar251);
          auVar69 = vfmadd231ps_fma(auVar159,auVar63,ZEXT816(0));
          auVar73 = vsubss_avx512f(auVar61,auVar81);
          auVar58 = vmovshdup_avx(auVar296);
          auVar149 = vfmadd231ss_fma(ZEXT416((uint)(auVar58._0_4_ * auVar81._0_4_)),auVar296,auVar73
                                    );
          auVar73 = vsubss_avx512f(auVar61,auVar82);
          auVar168 = vfmadd231ss_fma(ZEXT416((uint)(auVar82._0_4_ * auVar58._0_4_)),auVar296,auVar73
                                    );
          auVar63 = vdivss_avx512f(auVar61,auVar60);
          auVar58 = vsubps_avx(auVar65,auVar64);
          auVar140._0_4_ = auVar58._0_4_ * 3.0;
          auVar140._4_4_ = auVar58._4_4_ * 3.0;
          auVar140._8_4_ = auVar58._8_4_ * 3.0;
          auVar140._12_4_ = auVar58._12_4_ * 3.0;
          auVar58 = vsubps_avx(auVar66,auVar65);
          auVar212._0_4_ = auVar58._0_4_ * 3.0;
          auVar212._4_4_ = auVar58._4_4_ * 3.0;
          auVar212._8_4_ = auVar58._8_4_ * 3.0;
          auVar212._12_4_ = auVar58._12_4_ * 3.0;
          auVar58 = vsubps_avx(auVar69,auVar66);
          auVar229._0_4_ = auVar58._0_4_ * 3.0;
          auVar229._4_4_ = auVar58._4_4_ * 3.0;
          auVar229._8_4_ = auVar58._8_4_ * 3.0;
          auVar229._12_4_ = auVar58._12_4_ * 3.0;
          auVar73 = vminps_avx(auVar212,auVar229);
          auVar58 = vmaxps_avx(auVar212,auVar229);
          auVar73 = vminps_avx(auVar140,auVar73);
          auVar58 = vmaxps_avx(auVar140,auVar58);
          auVar60 = vshufpd_avx(auVar73,auVar73,3);
          auVar62 = vshufpd_avx(auVar58,auVar58,3);
          auVar73 = vminps_avx(auVar73,auVar60);
          auVar58 = vmaxps_avx(auVar58,auVar62);
          fVar263 = auVar63._0_4_;
          auVar230._0_4_ = fVar263 * auVar73._0_4_;
          auVar230._4_4_ = fVar263 * auVar73._4_4_;
          auVar230._8_4_ = fVar263 * auVar73._8_4_;
          auVar230._12_4_ = fVar263 * auVar73._12_4_;
          auVar213._0_4_ = fVar263 * auVar58._0_4_;
          auVar213._4_4_ = fVar263 * auVar58._4_4_;
          auVar213._8_4_ = fVar263 * auVar58._8_4_;
          auVar213._12_4_ = fVar263 * auVar58._12_4_;
          auVar70 = vdivss_avx512f(auVar61,ZEXT416((uint)(auVar168._0_4_ - auVar149._0_4_)));
          auVar58 = vshufpd_avx(auVar64,auVar64,3);
          auVar73 = vshufpd_avx(auVar65,auVar65,3);
          auVar60 = vshufpd_avx(auVar66,auVar66,3);
          auVar62 = vshufpd_avx(auVar69,auVar69,3);
          auVar58 = vsubps_avx(auVar58,auVar64);
          auVar63 = vsubps_avx(auVar73,auVar65);
          auVar64 = vsubps_avx(auVar60,auVar66);
          auVar62 = vsubps_avx(auVar62,auVar69);
          auVar73 = vminps_avx(auVar58,auVar63);
          auVar58 = vmaxps_avx(auVar58,auVar63);
          auVar60 = vminps_avx(auVar64,auVar62);
          auVar60 = vminps_avx(auVar73,auVar60);
          auVar73 = vmaxps_avx(auVar64,auVar62);
          auVar58 = vmaxps_avx(auVar58,auVar73);
          fVar263 = auVar70._0_4_;
          auVar252._0_4_ = fVar263 * auVar60._0_4_;
          auVar252._4_4_ = fVar263 * auVar60._4_4_;
          auVar252._8_4_ = fVar263 * auVar60._8_4_;
          auVar252._12_4_ = fVar263 * auVar60._12_4_;
          auVar265._0_4_ = fVar263 * auVar58._0_4_;
          auVar265._4_4_ = fVar263 * auVar58._4_4_;
          auVar265._8_4_ = fVar263 * auVar58._8_4_;
          auVar265._12_4_ = fVar263 * auVar58._12_4_;
          auVar82 = vinsertps_avx512f(auVar77,auVar149,0x10);
          auVar63 = vinsertps_avx(auVar76,auVar168,0x10);
          auVar123._0_4_ = auVar82._0_4_ + auVar63._0_4_;
          auVar123._4_4_ = auVar82._4_4_ + auVar63._4_4_;
          auVar123._8_4_ = auVar82._8_4_ + auVar63._8_4_;
          auVar123._12_4_ = auVar82._12_4_ + auVar63._12_4_;
          auVar83 = vmulps_avx512vl(auVar123,auVar302._0_16_);
          auVar60 = vshufps_avx(auVar83,auVar83,0x54);
          uVar119 = auVar83._0_4_;
          auVar141._4_4_ = uVar119;
          auVar141._0_4_ = uVar119;
          auVar141._8_4_ = uVar119;
          auVar141._12_4_ = uVar119;
          auVar62 = vfmadd213ps_avx512vl(local_270,auVar141,auVar68);
          auVar64 = vfmadd213ps_avx512vl(local_280,auVar141,auVar67);
          auVar73 = vfmadd213ps_fma(local_290,auVar141,auVar74);
          auVar58 = vsubps_avx(auVar64,auVar62);
          auVar62 = vfmadd213ps_fma(auVar58,auVar141,auVar62);
          auVar58 = vsubps_avx(auVar73,auVar64);
          auVar58 = vfmadd213ps_fma(auVar58,auVar141,auVar64);
          auVar58 = vsubps_avx(auVar58,auVar62);
          auVar73 = vfmadd231ps_fma(auVar62,auVar58,auVar141);
          auVar142._0_8_ = CONCAT44(auVar58._4_4_ * 3.0,auVar58._0_4_ * 3.0);
          auVar142._8_4_ = auVar58._8_4_ * 3.0;
          auVar142._12_4_ = auVar58._12_4_ * 3.0;
          auVar275._8_8_ = auVar73._0_8_;
          auVar275._0_8_ = auVar73._0_8_;
          auVar58 = vshufpd_avx(auVar73,auVar73,3);
          auVar73 = vshufps_avx(auVar83,auVar83,0x55);
          auVar62 = vsubps_avx(auVar58,auVar275);
          auVar64 = vfmadd231ps_fma(auVar275,auVar73,auVar62);
          auVar289._8_8_ = auVar142._0_8_;
          auVar289._0_8_ = auVar142._0_8_;
          auVar58 = vshufpd_avx(auVar142,auVar142,3);
          auVar58 = vsubps_avx(auVar58,auVar289);
          auVar73 = vfmadd213ps_fma(auVar58,auVar73,auVar289);
          auVar143._0_8_ = auVar62._0_8_ ^ 0x8000000080000000;
          auVar143._8_4_ = auVar62._8_4_ ^ 0x80000000;
          auVar143._12_4_ = auVar62._12_4_ ^ 0x80000000;
          auVar58 = vmovshdup_avx(auVar73);
          auVar290._0_8_ = auVar58._0_8_ ^ 0x8000000080000000;
          auVar290._8_4_ = auVar58._8_4_ ^ 0x80000000;
          auVar290._12_4_ = auVar58._12_4_ ^ 0x80000000;
          auVar65 = vmovshdup_avx512vl(auVar62);
          auVar66 = vpermt2ps_avx512vl(auVar290,ZEXT416(5),auVar62);
          auVar58 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar58._0_4_ * auVar62._0_4_)),auVar73,
                                        auVar65);
          auVar73 = vpermt2ps_avx512vl(auVar73,SUB6416(ZEXT464(4),0),auVar143);
          auVar160._0_4_ = auVar58._0_4_;
          auVar160._4_4_ = auVar160._0_4_;
          auVar160._8_4_ = auVar160._0_4_;
          auVar160._12_4_ = auVar160._0_4_;
          auVar58 = vdivps_avx(auVar66,auVar160);
          auVar73 = vdivps_avx(auVar73,auVar160);
          fVar247 = auVar64._0_4_;
          auVar62 = vshufps_avx(auVar64,auVar64,0x55);
          fVar263 = auVar73._0_4_;
          auVar276._0_4_ = fVar247 * auVar58._0_4_ + auVar62._0_4_ * fVar263;
          auVar276._4_4_ = fVar247 * auVar58._4_4_ + auVar62._4_4_ * auVar73._4_4_;
          auVar276._8_4_ = fVar247 * auVar58._8_4_ + auVar62._8_4_ * auVar73._8_4_;
          auVar276._12_4_ = fVar247 * auVar58._12_4_ + auVar62._12_4_ * auVar73._12_4_;
          auVar81 = vsubps_avx(auVar60,auVar276);
          auVar64 = vmovshdup_avx(auVar58);
          auVar60 = vinsertps_avx(auVar230,auVar252,0x1c);
          auVar291._0_4_ = auVar64._0_4_ * auVar60._0_4_;
          auVar291._4_4_ = auVar64._4_4_ * auVar60._4_4_;
          auVar291._8_4_ = auVar64._8_4_ * auVar60._8_4_;
          auVar291._12_4_ = auVar64._12_4_ * auVar60._12_4_;
          auVar62 = vinsertps_avx(auVar213,auVar265,0x1c);
          auVar277._0_4_ = auVar64._0_4_ * auVar62._0_4_;
          auVar277._4_4_ = auVar64._4_4_ * auVar62._4_4_;
          auVar277._8_4_ = auVar64._8_4_ * auVar62._8_4_;
          auVar277._12_4_ = auVar64._12_4_ * auVar62._12_4_;
          auVar70 = vminps_avx512vl(auVar291,auVar277);
          auVar66 = vmaxps_avx(auVar277,auVar291);
          auVar69 = vmovshdup_avx(auVar73);
          auVar64 = vinsertps_avx(auVar252,auVar230,0x4c);
          auVar253._0_4_ = auVar69._0_4_ * auVar64._0_4_;
          auVar253._4_4_ = auVar69._4_4_ * auVar64._4_4_;
          auVar253._8_4_ = auVar69._8_4_ * auVar64._8_4_;
          auVar253._12_4_ = auVar69._12_4_ * auVar64._12_4_;
          auVar65 = vinsertps_avx(auVar265,auVar213,0x4c);
          auVar266._0_4_ = auVar69._0_4_ * auVar65._0_4_;
          auVar266._4_4_ = auVar69._4_4_ * auVar65._4_4_;
          auVar266._8_4_ = auVar69._8_4_ * auVar65._8_4_;
          auVar266._12_4_ = auVar69._12_4_ * auVar65._12_4_;
          auVar69 = vminps_avx(auVar253,auVar266);
          auVar70 = vaddps_avx512vl(auVar70,auVar69);
          auVar69 = vmaxps_avx(auVar266,auVar253);
          auVar254._0_4_ = auVar66._0_4_ + auVar69._0_4_;
          auVar254._4_4_ = auVar66._4_4_ + auVar69._4_4_;
          auVar254._8_4_ = auVar66._8_4_ + auVar69._8_4_;
          auVar254._12_4_ = auVar66._12_4_ + auVar69._12_4_;
          auVar267._8_8_ = 0x3f80000000000000;
          auVar267._0_8_ = 0x3f80000000000000;
          auVar66 = vsubps_avx(auVar267,auVar254);
          auVar69 = vsubps_avx(auVar267,auVar70);
          auVar70 = vsubps_avx(auVar82,auVar83);
          auVar83 = vsubps_avx(auVar63,auVar83);
          fVar261 = auVar70._0_4_;
          auVar292._0_4_ = fVar261 * auVar66._0_4_;
          fVar262 = auVar70._4_4_;
          auVar292._4_4_ = fVar262 * auVar66._4_4_;
          fVar221 = auVar70._8_4_;
          auVar292._8_4_ = fVar221 * auVar66._8_4_;
          fVar222 = auVar70._12_4_;
          auVar292._12_4_ = fVar222 * auVar66._12_4_;
          auVar84 = vbroadcastss_avx512vl(auVar58);
          auVar60 = vmulps_avx512vl(auVar84,auVar60);
          auVar62 = vmulps_avx512vl(auVar84,auVar62);
          auVar84 = vminps_avx512vl(auVar60,auVar62);
          auVar60 = vmaxps_avx(auVar62,auVar60);
          auVar231._0_4_ = fVar263 * auVar64._0_4_;
          auVar231._4_4_ = fVar263 * auVar64._4_4_;
          auVar231._8_4_ = fVar263 * auVar64._8_4_;
          auVar231._12_4_ = fVar263 * auVar64._12_4_;
          auVar214._0_4_ = fVar263 * auVar65._0_4_;
          auVar214._4_4_ = fVar263 * auVar65._4_4_;
          auVar214._8_4_ = fVar263 * auVar65._8_4_;
          auVar214._12_4_ = fVar263 * auVar65._12_4_;
          auVar62 = vminps_avx(auVar231,auVar214);
          auVar64 = vaddps_avx512vl(auVar84,auVar62);
          auVar65 = vmulps_avx512vl(auVar70,auVar69);
          fVar247 = auVar83._0_4_;
          auVar255._0_4_ = fVar247 * auVar66._0_4_;
          fVar258 = auVar83._4_4_;
          auVar255._4_4_ = fVar258 * auVar66._4_4_;
          fVar259 = auVar83._8_4_;
          auVar255._8_4_ = fVar259 * auVar66._8_4_;
          fVar260 = auVar83._12_4_;
          auVar255._12_4_ = fVar260 * auVar66._12_4_;
          auVar268._0_4_ = fVar247 * auVar69._0_4_;
          auVar268._4_4_ = fVar258 * auVar69._4_4_;
          auVar268._8_4_ = fVar259 * auVar69._8_4_;
          auVar268._12_4_ = fVar260 * auVar69._12_4_;
          auVar62 = vmaxps_avx(auVar214,auVar231);
          auVar215._0_4_ = auVar60._0_4_ + auVar62._0_4_;
          auVar215._4_4_ = auVar60._4_4_ + auVar62._4_4_;
          auVar215._8_4_ = auVar60._8_4_ + auVar62._8_4_;
          auVar215._12_4_ = auVar60._12_4_ + auVar62._12_4_;
          auVar232._8_8_ = 0x3f800000;
          auVar232._0_8_ = 0x3f800000;
          auVar60 = vsubps_avx(auVar232,auVar215);
          auVar62 = vsubps_avx(auVar232,auVar64);
          auVar283._0_4_ = fVar261 * auVar60._0_4_;
          auVar283._4_4_ = fVar262 * auVar60._4_4_;
          auVar283._8_4_ = fVar221 * auVar60._8_4_;
          auVar283._12_4_ = fVar222 * auVar60._12_4_;
          auVar278._0_4_ = fVar261 * auVar62._0_4_;
          auVar278._4_4_ = fVar262 * auVar62._4_4_;
          auVar278._8_4_ = fVar221 * auVar62._8_4_;
          auVar278._12_4_ = fVar222 * auVar62._12_4_;
          auVar216._0_4_ = fVar247 * auVar60._0_4_;
          auVar216._4_4_ = fVar258 * auVar60._4_4_;
          auVar216._8_4_ = fVar259 * auVar60._8_4_;
          auVar216._12_4_ = fVar260 * auVar60._12_4_;
          auVar233._0_4_ = fVar247 * auVar62._0_4_;
          auVar233._4_4_ = fVar258 * auVar62._4_4_;
          auVar233._8_4_ = fVar259 * auVar62._8_4_;
          auVar233._12_4_ = fVar260 * auVar62._12_4_;
          auVar60 = vminps_avx(auVar283,auVar278);
          auVar62 = vminps_avx(auVar216,auVar233);
          auVar64 = vminps_avx(auVar60,auVar62);
          auVar60 = vmaxps_avx(auVar278,auVar283);
          auVar62 = vmaxps_avx(auVar233,auVar216);
          auVar62 = vmaxps_avx(auVar62,auVar60);
          auVar66 = vminps_avx512vl(auVar292,auVar65);
          auVar60 = vminps_avx(auVar255,auVar268);
          auVar60 = vminps_avx(auVar66,auVar60);
          auVar60 = vhaddps_avx(auVar64,auVar60);
          auVar65 = vmaxps_avx512vl(auVar65,auVar292);
          auVar64 = vmaxps_avx(auVar268,auVar255);
          auVar64 = vmaxps_avx(auVar64,auVar65);
          auVar62 = vhaddps_avx(auVar62,auVar64);
          auVar60 = vshufps_avx(auVar60,auVar60,0xe8);
          auVar62 = vshufps_avx(auVar62,auVar62,0xe8);
          auVar217._0_4_ = auVar60._0_4_ + auVar81._0_4_;
          auVar217._4_4_ = auVar60._4_4_ + auVar81._4_4_;
          auVar217._8_4_ = auVar60._8_4_ + auVar81._8_4_;
          auVar217._12_4_ = auVar60._12_4_ + auVar81._12_4_;
          auVar234._0_4_ = auVar62._0_4_ + auVar81._0_4_;
          auVar234._4_4_ = auVar62._4_4_ + auVar81._4_4_;
          auVar234._8_4_ = auVar62._8_4_ + auVar81._8_4_;
          auVar234._12_4_ = auVar62._12_4_ + auVar81._12_4_;
          auVar60 = vmaxps_avx(auVar82,auVar217);
          auVar62 = vminps_avx(auVar234,auVar63);
          uVar50 = vcmpps_avx512vl(auVar62,auVar60,1);
          auVar60 = vinsertps_avx(auVar149,auVar168,0x10);
          auVar297 = ZEXT1664(auVar60);
          if ((uVar50 & 3) == 0) {
            vucomiss_avx512f(auVar77);
            local_4d0 = auVar72._0_4_;
            fStack_4cc = auVar72._4_4_;
            fStack_4c8 = auVar72._8_4_;
            fStack_4c4 = auVar72._12_4_;
            if (uVar52 < 4 && (uVar6 == 0 || lVar51 == 0)) {
              bVar22 = false;
            }
            else {
              lVar51 = 200;
              do {
                auVar62 = vsubss_avx512f(auVar61,auVar81);
                fVar259 = auVar62._0_4_;
                fVar247 = fVar259 * fVar259 * fVar259;
                fVar260 = auVar81._0_4_;
                fVar258 = fVar260 * 3.0 * fVar259 * fVar259;
                fVar259 = fVar259 * fVar260 * fVar260 * 3.0;
                auVar192._4_4_ = fVar247;
                auVar192._0_4_ = fVar247;
                auVar192._8_4_ = fVar247;
                auVar192._12_4_ = fVar247;
                auVar172._4_4_ = fVar258;
                auVar172._0_4_ = fVar258;
                auVar172._8_4_ = fVar258;
                auVar172._12_4_ = fVar258;
                auVar134._4_4_ = fVar259;
                auVar134._0_4_ = fVar259;
                auVar134._8_4_ = fVar259;
                auVar134._12_4_ = fVar259;
                fVar260 = fVar260 * fVar260 * fVar260;
                auVar203._0_4_ = local_4d0 * fVar260;
                auVar203._4_4_ = fStack_4cc * fVar260;
                auVar203._8_4_ = fStack_4c8 * fVar260;
                auVar203._12_4_ = fStack_4c4 * fVar260;
                auVar62 = vfmadd231ps_fma(auVar203,auVar74,auVar134);
                auVar62 = vfmadd231ps_avx512vl(auVar62,auVar67,auVar172);
                auVar62 = vfmadd231ps_avx512vl(auVar62,auVar68,auVar192);
                auVar135._8_8_ = auVar62._0_8_;
                auVar135._0_8_ = auVar62._0_8_;
                auVar62 = vshufpd_avx(auVar62,auVar62,3);
                auVar63 = vshufps_avx(auVar81,auVar81,0x55);
                auVar62 = vsubps_avx(auVar62,auVar135);
                auVar63 = vfmadd213ps_fma(auVar62,auVar63,auVar135);
                fVar247 = auVar63._0_4_;
                auVar62 = vshufps_avx(auVar63,auVar63,0x55);
                auVar136._0_4_ = auVar58._0_4_ * fVar247 + fVar263 * auVar62._0_4_;
                auVar136._4_4_ = auVar58._4_4_ * fVar247 + auVar73._4_4_ * auVar62._4_4_;
                auVar136._8_4_ = auVar58._8_4_ * fVar247 + auVar73._8_4_ * auVar62._8_4_;
                auVar136._12_4_ = auVar58._12_4_ * fVar247 + auVar73._12_4_ * auVar62._12_4_;
                auVar81 = vsubps_avx(auVar81,auVar136);
                auVar62 = vandps_avx512vl(auVar63,auVar299._0_16_);
                auVar63 = vprolq_avx512vl(auVar62,0x20);
                auVar62 = vmaxss_avx(auVar63,auVar62);
                bVar56 = auVar62._0_4_ <= fVar124;
                if (auVar62._0_4_ < fVar124) {
                  auVar58 = vucomiss_avx512f(auVar75);
                  if (bVar56) {
                    auVar73 = vucomiss_avx512f(auVar58);
                    auVar300 = ZEXT1664(auVar73);
                    if (bVar56) {
                      vmovshdup_avx(auVar58);
                      auVar73 = vucomiss_avx512f(auVar75);
                      if (bVar56) {
                        auVar61 = vucomiss_avx512f(auVar73);
                        auVar300 = ZEXT1664(auVar61);
                        if (bVar56) {
                          auVar62 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]
                                                         ),ZEXT416((uint)pre->ray_space[k].vy.
                                                                         field_0.m128[2]),0x1c);
                          auVar83 = vinsertps_avx(auVar62,ZEXT416((uint)pre->ray_space[k].vz.field_0
                                                                        .m128[2]),0x28);
                          auVar62 = vdpps_avx(auVar83,local_2a0,0x7f);
                          auVar63 = vdpps_avx(auVar83,local_2b0,0x7f);
                          auVar64 = vdpps_avx(auVar83,local_2c0,0x7f);
                          auVar65 = vdpps_avx(auVar83,local_2d0,0x7f);
                          auVar66 = vdpps_avx(auVar83,local_2e0,0x7f);
                          auVar69 = vdpps_avx(auVar83,local_2f0,0x7f);
                          auVar70 = vdpps_avx(auVar83,local_300,0x7f);
                          auVar83 = vdpps_avx(auVar83,local_310,0x7f);
                          auVar81 = vsubss_avx512f(auVar61,auVar73);
                          fVar263 = auVar73._0_4_;
                          auVar73 = vfmadd231ss_fma(ZEXT416((uint)(fVar263 * auVar66._0_4_)),auVar81
                                                    ,auVar62);
                          auVar62 = vfmadd231ss_fma(ZEXT416((uint)(auVar69._0_4_ * fVar263)),auVar81
                                                    ,auVar63);
                          auVar63 = vfmadd231ss_fma(ZEXT416((uint)(auVar70._0_4_ * fVar263)),auVar81
                                                    ,auVar64);
                          auVar64 = vfmadd231ss_fma(ZEXT416((uint)(fVar263 * auVar83._0_4_)),auVar81
                                                    ,auVar65);
                          auVar61 = vsubss_avx512f(auVar61,auVar58);
                          auVar204._0_4_ = auVar61._0_4_;
                          fVar263 = auVar204._0_4_ * auVar204._0_4_ * auVar204._0_4_;
                          local_120 = auVar58._0_4_;
                          fVar247 = local_120 * 3.0 * auVar204._0_4_ * auVar204._0_4_;
                          fVar258 = auVar204._0_4_ * local_120 * local_120 * 3.0;
                          fVar260 = local_120 * local_120 * local_120;
                          auVar61 = vfmadd231ss_fma(ZEXT416((uint)(fVar260 * auVar64._0_4_)),
                                                    ZEXT416((uint)fVar258),auVar63);
                          auVar61 = vfmadd231ss_fma(auVar61,ZEXT416((uint)fVar247),auVar62);
                          auVar73 = vfmadd231ss_fma(auVar61,ZEXT416((uint)fVar263),auVar73);
                          fVar259 = auVar73._0_4_;
                          if ((fVar118 <= fVar259) &&
                             (fVar261 = *(float *)(ray + k * 4 + 0x100), fVar259 <= fVar261)) {
                            auVar73 = vshufps_avx(auVar58,auVar58,0x55);
                            auVar235._8_4_ = 0x3f800000;
                            auVar235._0_8_ = &DAT_3f8000003f800000;
                            auVar235._12_4_ = 0x3f800000;
                            auVar61 = vsubps_avx(auVar235,auVar73);
                            fVar262 = auVar73._0_4_;
                            auVar243._0_4_ = fVar262 * (float)local_360._0_4_;
                            fVar221 = auVar73._4_4_;
                            auVar243._4_4_ = fVar221 * (float)local_360._4_4_;
                            fVar222 = auVar73._8_4_;
                            auVar243._8_4_ = fVar222 * fStack_358;
                            fVar223 = auVar73._12_4_;
                            auVar243._12_4_ = fVar223 * fStack_354;
                            auVar256._0_4_ = fVar262 * (float)local_370._0_4_;
                            auVar256._4_4_ = fVar221 * (float)local_370._4_4_;
                            auVar256._8_4_ = fVar222 * fStack_368;
                            auVar256._12_4_ = fVar223 * fStack_364;
                            auVar269._0_4_ = fVar262 * (float)local_380._0_4_;
                            auVar269._4_4_ = fVar221 * (float)local_380._4_4_;
                            auVar269._8_4_ = fVar222 * fStack_378;
                            auVar269._12_4_ = fVar223 * fStack_374;
                            auVar218._0_4_ = fVar262 * (float)local_390._0_4_;
                            auVar218._4_4_ = fVar221 * (float)local_390._4_4_;
                            auVar218._8_4_ = fVar222 * fStack_388;
                            auVar218._12_4_ = fVar223 * fStack_384;
                            auVar73 = vfmadd231ps_fma(auVar243,auVar61,local_320);
                            auVar62 = vfmadd231ps_fma(auVar256,auVar61,local_330);
                            auVar63 = vfmadd231ps_fma(auVar269,auVar61,local_340);
                            auVar64 = vfmadd231ps_fma(auVar218,auVar61,local_350);
                            auVar73 = vsubps_avx(auVar62,auVar73);
                            auVar61 = vsubps_avx(auVar63,auVar62);
                            auVar62 = vsubps_avx(auVar64,auVar63);
                            auVar270._0_4_ = local_120 * auVar61._0_4_;
                            auVar270._4_4_ = local_120 * auVar61._4_4_;
                            auVar270._8_4_ = local_120 * auVar61._8_4_;
                            auVar270._12_4_ = local_120 * auVar61._12_4_;
                            auVar204._4_4_ = auVar204._0_4_;
                            auVar204._8_4_ = auVar204._0_4_;
                            auVar204._12_4_ = auVar204._0_4_;
                            auVar73 = vfmadd231ps_fma(auVar270,auVar204,auVar73);
                            auVar219._0_4_ = local_120 * auVar62._0_4_;
                            auVar219._4_4_ = local_120 * auVar62._4_4_;
                            auVar219._8_4_ = local_120 * auVar62._8_4_;
                            auVar219._12_4_ = local_120 * auVar62._12_4_;
                            auVar61 = vfmadd231ps_fma(auVar219,auVar204,auVar61);
                            auVar220._0_4_ = local_120 * auVar61._0_4_;
                            auVar220._4_4_ = local_120 * auVar61._4_4_;
                            auVar220._8_4_ = local_120 * auVar61._8_4_;
                            auVar220._12_4_ = local_120 * auVar61._12_4_;
                            auVar73 = vfmadd231ps_fma(auVar220,auVar204,auVar73);
                            auVar39._8_4_ = 0x40400000;
                            auVar39._0_8_ = 0x4040000040400000;
                            auVar39._12_4_ = 0x40400000;
                            auVar73 = vmulps_avx512vl(auVar73,auVar39);
                            pGVar7 = (context->scene->geometries).items[uVar54].ptr;
                            if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                              bVar56 = false;
                            }
                            else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                    (bVar56 = true,
                                    pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                              auVar193._0_4_ = fVar260 * (float)local_3e0._0_4_;
                              auVar193._4_4_ = fVar260 * (float)local_3e0._4_4_;
                              auVar193._8_4_ = fVar260 * fStack_3d8;
                              auVar193._12_4_ = fVar260 * fStack_3d4;
                              auVar173._4_4_ = fVar258;
                              auVar173._0_4_ = fVar258;
                              auVar173._8_4_ = fVar258;
                              auVar173._12_4_ = fVar258;
                              auVar61 = vfmadd132ps_fma(auVar173,auVar193,local_3d0);
                              auVar161._4_4_ = fVar247;
                              auVar161._0_4_ = fVar247;
                              auVar161._8_4_ = fVar247;
                              auVar161._12_4_ = fVar247;
                              auVar61 = vfmadd132ps_fma(auVar161,auVar61,local_3c0);
                              auVar144._4_4_ = fVar263;
                              auVar144._0_4_ = fVar263;
                              auVar144._8_4_ = fVar263;
                              auVar144._12_4_ = fVar263;
                              auVar63 = vfmadd132ps_fma(auVar144,auVar61,local_3b0);
                              auVar61 = vshufps_avx(auVar63,auVar63,0xc9);
                              auVar62 = vshufps_avx(auVar73,auVar73,0xc9);
                              auVar145._0_4_ = auVar63._0_4_ * auVar62._0_4_;
                              auVar145._4_4_ = auVar63._4_4_ * auVar62._4_4_;
                              auVar145._8_4_ = auVar63._8_4_ * auVar62._8_4_;
                              auVar145._12_4_ = auVar63._12_4_ * auVar62._12_4_;
                              auVar73 = vfmsub231ps_fma(auVar145,auVar73,auVar61);
                              auVar176._8_4_ = 1;
                              auVar176._0_8_ = 0x100000001;
                              auVar176._12_4_ = 1;
                              auVar176._16_4_ = 1;
                              auVar176._20_4_ = 1;
                              auVar176._24_4_ = 1;
                              auVar176._28_4_ = 1;
                              local_100 = vpermps_avx2(auVar176,ZEXT1632(auVar58));
                              auVar103 = vpermps_avx2(auVar176,ZEXT1632(auVar73));
                              auVar194._8_4_ = 2;
                              auVar194._0_8_ = 0x200000002;
                              auVar194._12_4_ = 2;
                              auVar194._16_4_ = 2;
                              auVar194._20_4_ = 2;
                              auVar194._24_4_ = 2;
                              auVar194._28_4_ = 2;
                              local_160 = vpermps_avx2(auVar194,ZEXT1632(auVar73));
                              local_140 = auVar73._0_4_;
                              local_180[0] = (RTCHitN)auVar103[0];
                              local_180[1] = (RTCHitN)auVar103[1];
                              local_180[2] = (RTCHitN)auVar103[2];
                              local_180[3] = (RTCHitN)auVar103[3];
                              local_180[4] = (RTCHitN)auVar103[4];
                              local_180[5] = (RTCHitN)auVar103[5];
                              local_180[6] = (RTCHitN)auVar103[6];
                              local_180[7] = (RTCHitN)auVar103[7];
                              local_180[8] = (RTCHitN)auVar103[8];
                              local_180[9] = (RTCHitN)auVar103[9];
                              local_180[10] = (RTCHitN)auVar103[10];
                              local_180[0xb] = (RTCHitN)auVar103[0xb];
                              local_180[0xc] = (RTCHitN)auVar103[0xc];
                              local_180[0xd] = (RTCHitN)auVar103[0xd];
                              local_180[0xe] = (RTCHitN)auVar103[0xe];
                              local_180[0xf] = (RTCHitN)auVar103[0xf];
                              local_180[0x10] = (RTCHitN)auVar103[0x10];
                              local_180[0x11] = (RTCHitN)auVar103[0x11];
                              local_180[0x12] = (RTCHitN)auVar103[0x12];
                              local_180[0x13] = (RTCHitN)auVar103[0x13];
                              local_180[0x14] = (RTCHitN)auVar103[0x14];
                              local_180[0x15] = (RTCHitN)auVar103[0x15];
                              local_180[0x16] = (RTCHitN)auVar103[0x16];
                              local_180[0x17] = (RTCHitN)auVar103[0x17];
                              local_180[0x18] = (RTCHitN)auVar103[0x18];
                              local_180[0x19] = (RTCHitN)auVar103[0x19];
                              local_180[0x1a] = (RTCHitN)auVar103[0x1a];
                              local_180[0x1b] = (RTCHitN)auVar103[0x1b];
                              local_180[0x1c] = (RTCHitN)auVar103[0x1c];
                              local_180[0x1d] = (RTCHitN)auVar103[0x1d];
                              local_180[0x1e] = (RTCHitN)auVar103[0x1e];
                              local_180[0x1f] = (RTCHitN)auVar103[0x1f];
                              uStack_13c = local_140;
                              uStack_138 = local_140;
                              uStack_134 = local_140;
                              uStack_130 = local_140;
                              uStack_12c = local_140;
                              uStack_128 = local_140;
                              uStack_124 = local_140;
                              fStack_11c = local_120;
                              fStack_118 = local_120;
                              fStack_114 = local_120;
                              fStack_110 = local_120;
                              fStack_10c = local_120;
                              fStack_108 = local_120;
                              fStack_104 = local_120;
                              local_e0 = local_200._0_8_;
                              uStack_d8 = local_200._8_8_;
                              uStack_d0 = local_200._16_8_;
                              uStack_c8 = local_200._24_8_;
                              local_c0 = local_220;
                              vpcmpeqd_avx2(local_220,local_220);
                              uStack_9c = context->user->instID[0];
                              local_a0 = uStack_9c;
                              uStack_98 = uStack_9c;
                              uStack_94 = uStack_9c;
                              uStack_90 = uStack_9c;
                              uStack_8c = uStack_9c;
                              uStack_88 = uStack_9c;
                              uStack_84 = uStack_9c;
                              uStack_7c = context->user->instPrimID[0];
                              local_80 = uStack_7c;
                              uStack_78 = uStack_7c;
                              uStack_74 = uStack_7c;
                              uStack_70 = uStack_7c;
                              uStack_6c = uStack_7c;
                              uStack_68 = uStack_7c;
                              uStack_64 = uStack_7c;
                              *(float *)(ray + k * 4 + 0x100) = fVar259;
                              local_400 = local_240._0_8_;
                              uStack_3f8 = local_240._8_8_;
                              uStack_3f0 = local_240._16_8_;
                              uStack_3e8 = local_240._24_8_;
                              local_430.valid = (int *)&local_400;
                              local_430.geometryUserPtr = pGVar7->userPtr;
                              local_430.context = context->user;
                              local_430.ray = (RTCRayN *)ray;
                              local_430.hit = local_180;
                              local_430.N = 8;
                              if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                (*pGVar7->occlusionFilterN)(&local_430);
                                auVar103 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                auVar298 = ZEXT3264(auVar103);
                                auVar300 = ZEXT464(0x3f800000);
                                auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                                auVar302 = ZEXT1664(auVar58);
                                auVar58 = vxorps_avx512vl(auVar75,auVar75);
                                auVar304 = ZEXT1664(auVar58);
                                auVar58 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                auVar299 = ZEXT1664(auVar58);
                              }
                              auVar58 = auVar304._0_16_;
                              auVar43._8_8_ = uStack_3f8;
                              auVar43._0_8_ = local_400;
                              auVar43._16_8_ = uStack_3f0;
                              auVar43._24_8_ = uStack_3e8;
                              if (auVar43 == (undefined1  [32])0x0) {
                                bVar56 = false;
                              }
                              else {
                                p_Var12 = context->args->filter;
                                if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                                  (*p_Var12)(&local_430);
                                  auVar103 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  auVar298 = ZEXT3264(auVar103);
                                  auVar300 = ZEXT464(0x3f800000);
                                  auVar73 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                                  auVar302 = ZEXT1664(auVar73);
                                  auVar58 = vxorps_avx512vl(auVar58,auVar58);
                                  auVar304 = ZEXT1664(auVar58);
                                  auVar58 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar299 = ZEXT1664(auVar58);
                                }
                                auVar44._8_8_ = uStack_3f8;
                                auVar44._0_8_ = local_400;
                                auVar44._16_8_ = uStack_3f0;
                                auVar44._24_8_ = uStack_3e8;
                                uVar50 = vptestmd_avx512vl(auVar44,auVar44);
                                auVar103 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                bVar56 = (bool)((byte)uVar50 & 1);
                                bVar13 = (bool)((byte)(uVar50 >> 1) & 1);
                                bVar14 = (bool)((byte)(uVar50 >> 2) & 1);
                                bVar15 = (bool)((byte)(uVar50 >> 3) & 1);
                                bVar16 = (bool)((byte)(uVar50 >> 4) & 1);
                                bVar17 = (bool)((byte)(uVar50 >> 5) & 1);
                                bVar18 = (bool)((byte)(uVar50 >> 6) & 1);
                                bVar19 = SUB81(uVar50 >> 7,0);
                                *(uint *)(local_430.ray + 0x100) =
                                     (uint)bVar56 * auVar103._0_4_ |
                                     (uint)!bVar56 * *(int *)(local_430.ray + 0x100);
                                *(uint *)(local_430.ray + 0x104) =
                                     (uint)bVar13 * auVar103._4_4_ |
                                     (uint)!bVar13 * *(int *)(local_430.ray + 0x104);
                                *(uint *)(local_430.ray + 0x108) =
                                     (uint)bVar14 * auVar103._8_4_ |
                                     (uint)!bVar14 * *(int *)(local_430.ray + 0x108);
                                *(uint *)(local_430.ray + 0x10c) =
                                     (uint)bVar15 * auVar103._12_4_ |
                                     (uint)!bVar15 * *(int *)(local_430.ray + 0x10c);
                                *(uint *)(local_430.ray + 0x110) =
                                     (uint)bVar16 * auVar103._16_4_ |
                                     (uint)!bVar16 * *(int *)(local_430.ray + 0x110);
                                *(uint *)(local_430.ray + 0x114) =
                                     (uint)bVar17 * auVar103._20_4_ |
                                     (uint)!bVar17 * *(int *)(local_430.ray + 0x114);
                                *(uint *)(local_430.ray + 0x118) =
                                     (uint)bVar18 * auVar103._24_4_ |
                                     (uint)!bVar18 * *(int *)(local_430.ray + 0x118);
                                *(uint *)(local_430.ray + 0x11c) =
                                     (uint)bVar19 * auVar103._28_4_ |
                                     (uint)!bVar19 * *(int *)(local_430.ray + 0x11c);
                                bVar56 = auVar44 != (undefined1  [32])0x0;
                              }
                              if (!bVar56) {
                                *(float *)(ray + k * 4 + 0x100) = fVar261;
                              }
                            }
                            auVar297 = ZEXT1664(auVar60);
                            bVar55 = (bool)(bVar55 | bVar56);
                          }
                        }
                      }
                    }
                  }
                  break;
                }
                lVar51 = lVar51 + -1;
              } while (lVar51 != 0);
            }
          }
        }
      }
    } while (bVar22);
    auVar58 = vinsertps_avx512f(auVar77,auVar76,0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }